

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O3

bool embree::avx512::CurveNvIntersectorK<8,4>::
     occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::BSplineCurveT,4,8>,embree::avx512::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Primitive PVar9;
  int iVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined8 uVar18;
  long lVar19;
  long lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  long lVar62;
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  byte bVar65;
  ulong uVar66;
  uint uVar67;
  ulong uVar68;
  ulong uVar69;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  long lVar70;
  Geometry *pGVar71;
  byte bVar72;
  ulong uVar73;
  float fVar74;
  float fVar120;
  float fVar122;
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar80 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar81 [16];
  float fVar121;
  float fVar123;
  float fVar124;
  float fVar125;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  float fVar126;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  float fVar127;
  undefined4 uVar128;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar134;
  undefined1 auVar133 [32];
  float fVar135;
  undefined8 uVar136;
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  float fVar142;
  float fVar143;
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  float fVar155;
  float fVar156;
  float fVar158;
  float fVar159;
  undefined1 auVar157 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [64];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [64];
  undefined1 auVar178 [64];
  undefined1 auVar179 [64];
  undefined1 auVar180 [64];
  undefined1 auVar181 [64];
  undefined1 auVar182 [64];
  undefined1 auVar183 [64];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  RTCFilterFunctionNArguments args;
  float old_t;
  float old_t_1;
  undefined1 local_5f0 [16];
  Precalculations *local_5e0;
  ulong local_5d8;
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [16];
  Geometry *local_598;
  RTCFilterFunctionNArguments local_590;
  undefined1 local_560 [32];
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [16];
  undefined1 local_390 [8];
  float fStack_388;
  float fStack_384;
  undefined8 local_380;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined4 local_350;
  undefined4 uStack_34c;
  undefined4 uStack_348;
  undefined4 uStack_344;
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined1 local_320 [16];
  undefined4 local_310;
  undefined4 uStack_30c;
  undefined4 uStack_308;
  undefined4 uStack_304;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined1 local_2f0 [16];
  uint local_2e0;
  uint uStack_2dc;
  uint uStack_2d8;
  uint uStack_2d4;
  uint uStack_2d0;
  uint uStack_2cc;
  uint uStack_2c8;
  uint uStack_2c4;
  uint local_2c0;
  undefined4 uStack_2bc;
  undefined4 uStack_2b8;
  undefined4 uStack_2b4;
  undefined4 uStack_2b0;
  undefined4 uStack_2ac;
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined4 local_240;
  int local_23c;
  undefined1 local_230 [16];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  float local_1e0 [4];
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined4 uStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar173 [64];
  
  PVar9 = prim[1];
  uVar66 = (ulong)(byte)PVar9;
  lVar62 = uVar66 * 0x19;
  fVar135 = *(float *)(prim + lVar62 + 0x12);
  auVar77 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar77 = vinsertps_avx(auVar77,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar79 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar80 = vinsertps_avx(auVar79,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar139 = vsubps_avx(auVar77,*(undefined1 (*) [16])(prim + lVar62 + 6));
  fVar142 = fVar135 * auVar139._0_4_;
  fVar127 = fVar135 * auVar80._0_4_;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar66 * 4 + 6);
  auVar88 = vpmovsxbd_avx2(auVar77);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar66 * 5 + 6);
  auVar85 = vpmovsxbd_avx2(auVar79);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar66 * 6 + 6);
  auVar86 = vpmovsxbd_avx2(auVar76);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar66 * 0xb + 6);
  auVar87 = vpmovsxbd_avx2(auVar75);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar9 * 0xc) + 6);
  auVar92 = vpmovsxbd_avx2(auVar5);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar90 = vcvtdq2ps_avx(auVar92);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + (uint)(byte)PVar9 * 0xc + uVar66 + 6);
  auVar89 = vpmovsxbd_avx2(auVar6);
  auVar89 = vcvtdq2ps_avx(auVar89);
  uVar68 = (ulong)(uint)((int)(uVar66 * 9) * 2);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar68 + 6);
  auVar98 = vpmovsxbd_avx2(auVar7);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar68 + uVar66 + 6);
  auVar97 = vpmovsxbd_avx2(auVar8);
  auVar97 = vcvtdq2ps_avx(auVar97);
  uVar73 = (ulong)(uint)((int)(uVar66 * 5) << 2);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar73 + 6);
  auVar84 = vpmovsxbd_avx2(auVar78);
  auVar91 = vcvtdq2ps_avx(auVar84);
  auVar169._4_4_ = fVar127;
  auVar169._0_4_ = fVar127;
  auVar169._8_4_ = fVar127;
  auVar169._12_4_ = fVar127;
  auVar169._16_4_ = fVar127;
  auVar169._20_4_ = fVar127;
  auVar169._24_4_ = fVar127;
  auVar169._28_4_ = fVar127;
  auVar174._8_4_ = 1;
  auVar174._0_8_ = 0x100000001;
  auVar174._12_4_ = 1;
  auVar174._16_4_ = 1;
  auVar174._20_4_ = 1;
  auVar174._24_4_ = 1;
  auVar174._28_4_ = 1;
  auVar82 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar94 = ZEXT1632(CONCAT412(fVar135 * auVar80._12_4_,
                               CONCAT48(fVar135 * auVar80._8_4_,
                                        CONCAT44(fVar135 * auVar80._4_4_,fVar127))));
  auVar93 = vpermps_avx2(auVar174,auVar94);
  auVar83 = vpermps_avx512vl(auVar82,auVar94);
  fVar127 = auVar83._0_4_;
  fVar143 = auVar83._4_4_;
  auVar94._4_4_ = fVar143 * auVar86._4_4_;
  auVar94._0_4_ = fVar127 * auVar86._0_4_;
  fVar134 = auVar83._8_4_;
  auVar94._8_4_ = fVar134 * auVar86._8_4_;
  fVar156 = auVar83._12_4_;
  auVar94._12_4_ = fVar156 * auVar86._12_4_;
  fVar159 = auVar83._16_4_;
  auVar94._16_4_ = fVar159 * auVar86._16_4_;
  fVar155 = auVar83._20_4_;
  auVar94._20_4_ = fVar155 * auVar86._20_4_;
  fVar158 = auVar83._24_4_;
  auVar94._24_4_ = fVar158 * auVar86._24_4_;
  auVar94._28_4_ = auVar92._28_4_;
  auVar92._4_4_ = auVar89._4_4_ * fVar143;
  auVar92._0_4_ = auVar89._0_4_ * fVar127;
  auVar92._8_4_ = auVar89._8_4_ * fVar134;
  auVar92._12_4_ = auVar89._12_4_ * fVar156;
  auVar92._16_4_ = auVar89._16_4_ * fVar159;
  auVar92._20_4_ = auVar89._20_4_ * fVar155;
  auVar92._24_4_ = auVar89._24_4_ * fVar158;
  auVar92._28_4_ = auVar84._28_4_;
  auVar84._4_4_ = auVar91._4_4_ * fVar143;
  auVar84._0_4_ = auVar91._0_4_ * fVar127;
  auVar84._8_4_ = auVar91._8_4_ * fVar134;
  auVar84._12_4_ = auVar91._12_4_ * fVar156;
  auVar84._16_4_ = auVar91._16_4_ * fVar159;
  auVar84._20_4_ = auVar91._20_4_ * fVar155;
  auVar84._24_4_ = auVar91._24_4_ * fVar158;
  auVar84._28_4_ = auVar83._28_4_;
  auVar77 = vfmadd231ps_fma(auVar94,auVar93,auVar85);
  auVar79 = vfmadd231ps_fma(auVar92,auVar93,auVar90);
  auVar76 = vfmadd231ps_fma(auVar84,auVar97,auVar93);
  auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar169,auVar88);
  auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar169,auVar87);
  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar98,auVar169);
  auVar170._4_4_ = fVar142;
  auVar170._0_4_ = fVar142;
  auVar170._8_4_ = fVar142;
  auVar170._12_4_ = fVar142;
  auVar170._16_4_ = fVar142;
  auVar170._20_4_ = fVar142;
  auVar170._24_4_ = fVar142;
  auVar170._28_4_ = fVar142;
  auVar84 = ZEXT1632(CONCAT412(fVar135 * auVar139._12_4_,
                               CONCAT48(fVar135 * auVar139._8_4_,
                                        CONCAT44(fVar135 * auVar139._4_4_,fVar142))));
  auVar92 = vpermps_avx2(auVar174,auVar84);
  auVar84 = vpermps_avx512vl(auVar82,auVar84);
  fVar135 = auVar84._0_4_;
  fVar127 = auVar84._4_4_;
  auVar93._4_4_ = fVar127 * auVar86._4_4_;
  auVar93._0_4_ = fVar135 * auVar86._0_4_;
  fVar143 = auVar84._8_4_;
  auVar93._8_4_ = fVar143 * auVar86._8_4_;
  fVar134 = auVar84._12_4_;
  auVar93._12_4_ = fVar134 * auVar86._12_4_;
  fVar156 = auVar84._16_4_;
  auVar93._16_4_ = fVar156 * auVar86._16_4_;
  fVar159 = auVar84._20_4_;
  auVar93._20_4_ = fVar159 * auVar86._20_4_;
  fVar155 = auVar84._24_4_;
  auVar93._24_4_ = fVar155 * auVar86._24_4_;
  auVar93._28_4_ = 1;
  auVar82._4_4_ = auVar89._4_4_ * fVar127;
  auVar82._0_4_ = auVar89._0_4_ * fVar135;
  auVar82._8_4_ = auVar89._8_4_ * fVar143;
  auVar82._12_4_ = auVar89._12_4_ * fVar134;
  auVar82._16_4_ = auVar89._16_4_ * fVar156;
  auVar82._20_4_ = auVar89._20_4_ * fVar159;
  auVar82._24_4_ = auVar89._24_4_ * fVar155;
  auVar82._28_4_ = auVar86._28_4_;
  auVar89._4_4_ = auVar91._4_4_ * fVar127;
  auVar89._0_4_ = auVar91._0_4_ * fVar135;
  auVar89._8_4_ = auVar91._8_4_ * fVar143;
  auVar89._12_4_ = auVar91._12_4_ * fVar134;
  auVar89._16_4_ = auVar91._16_4_ * fVar156;
  auVar89._20_4_ = auVar91._20_4_ * fVar159;
  auVar89._24_4_ = auVar91._24_4_ * fVar155;
  auVar89._28_4_ = auVar84._28_4_;
  auVar75 = vfmadd231ps_fma(auVar93,auVar92,auVar85);
  auVar5 = vfmadd231ps_fma(auVar82,auVar92,auVar90);
  auVar6 = vfmadd231ps_fma(auVar89,auVar92,auVar97);
  auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar170,auVar88);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar170,auVar87);
  auVar160._8_4_ = 0x7fffffff;
  auVar160._0_8_ = 0x7fffffff7fffffff;
  auVar160._12_4_ = 0x7fffffff;
  auVar160._16_4_ = 0x7fffffff;
  auVar160._20_4_ = 0x7fffffff;
  auVar160._24_4_ = 0x7fffffff;
  auVar160._28_4_ = 0x7fffffff;
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar170,auVar98);
  auVar88 = vandps_avx(ZEXT1632(auVar77),auVar160);
  auVar157._8_4_ = 0x219392ef;
  auVar157._0_8_ = 0x219392ef219392ef;
  auVar157._12_4_ = 0x219392ef;
  auVar157._16_4_ = 0x219392ef;
  auVar157._20_4_ = 0x219392ef;
  auVar157._24_4_ = 0x219392ef;
  auVar157._28_4_ = 0x219392ef;
  uVar68 = vcmpps_avx512vl(auVar88,auVar157,1);
  bVar12 = (bool)((byte)uVar68 & 1);
  auVar83._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar77._0_4_;
  bVar12 = (bool)((byte)(uVar68 >> 1) & 1);
  auVar83._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar77._4_4_;
  bVar12 = (bool)((byte)(uVar68 >> 2) & 1);
  auVar83._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar77._8_4_;
  bVar12 = (bool)((byte)(uVar68 >> 3) & 1);
  auVar83._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar77._12_4_;
  auVar83._16_4_ = (uint)((byte)(uVar68 >> 4) & 1) * 0x219392ef;
  auVar83._20_4_ = (uint)((byte)(uVar68 >> 5) & 1) * 0x219392ef;
  auVar83._24_4_ = (uint)((byte)(uVar68 >> 6) & 1) * 0x219392ef;
  auVar83._28_4_ = (uint)(byte)(uVar68 >> 7) * 0x219392ef;
  auVar88 = vandps_avx(ZEXT1632(auVar79),auVar160);
  uVar68 = vcmpps_avx512vl(auVar88,auVar157,1);
  bVar12 = (bool)((byte)uVar68 & 1);
  auVar95._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar79._0_4_;
  bVar12 = (bool)((byte)(uVar68 >> 1) & 1);
  auVar95._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar79._4_4_;
  bVar12 = (bool)((byte)(uVar68 >> 2) & 1);
  auVar95._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar79._8_4_;
  bVar12 = (bool)((byte)(uVar68 >> 3) & 1);
  auVar95._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar79._12_4_;
  auVar95._16_4_ = (uint)((byte)(uVar68 >> 4) & 1) * 0x219392ef;
  auVar95._20_4_ = (uint)((byte)(uVar68 >> 5) & 1) * 0x219392ef;
  auVar95._24_4_ = (uint)((byte)(uVar68 >> 6) & 1) * 0x219392ef;
  auVar95._28_4_ = (uint)(byte)(uVar68 >> 7) * 0x219392ef;
  auVar88 = vandps_avx(ZEXT1632(auVar76),auVar160);
  uVar68 = vcmpps_avx512vl(auVar88,auVar157,1);
  bVar12 = (bool)((byte)uVar68 & 1);
  auVar88._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar76._0_4_;
  bVar12 = (bool)((byte)(uVar68 >> 1) & 1);
  auVar88._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar76._4_4_;
  bVar12 = (bool)((byte)(uVar68 >> 2) & 1);
  auVar88._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar76._8_4_;
  bVar12 = (bool)((byte)(uVar68 >> 3) & 1);
  auVar88._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar76._12_4_;
  auVar88._16_4_ = (uint)((byte)(uVar68 >> 4) & 1) * 0x219392ef;
  auVar88._20_4_ = (uint)((byte)(uVar68 >> 5) & 1) * 0x219392ef;
  auVar88._24_4_ = (uint)((byte)(uVar68 >> 6) & 1) * 0x219392ef;
  auVar88._28_4_ = (uint)(byte)(uVar68 >> 7) * 0x219392ef;
  auVar85 = vrcp14ps_avx512vl(auVar83);
  auVar86 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar87 = vfnmadd213ps_avx512vl(auVar83,auVar85,auVar86);
  auVar77 = vfmadd132ps_fma(auVar87,auVar85,auVar85);
  auVar85 = vrcp14ps_avx512vl(auVar95);
  auVar87 = vfnmadd213ps_avx512vl(auVar95,auVar85,auVar86);
  auVar79 = vfmadd132ps_fma(auVar87,auVar85,auVar85);
  auVar85 = vrcp14ps_avx512vl(auVar88);
  auVar88 = vfnmadd213ps_avx512vl(auVar88,auVar85,auVar86);
  auVar76 = vfmadd132ps_fma(auVar88,auVar85,auVar85);
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar66 * 7 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,ZEXT1632(auVar75));
  auVar98._4_4_ = auVar77._4_4_ * auVar88._4_4_;
  auVar98._0_4_ = auVar77._0_4_ * auVar88._0_4_;
  auVar98._8_4_ = auVar77._8_4_ * auVar88._8_4_;
  auVar98._12_4_ = auVar77._12_4_ * auVar88._12_4_;
  auVar98._16_4_ = auVar88._16_4_ * 0.0;
  auVar98._20_4_ = auVar88._20_4_ * 0.0;
  auVar98._24_4_ = auVar88._24_4_ * 0.0;
  auVar98._28_4_ = auVar88._28_4_;
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar66 * 9 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,ZEXT1632(auVar75));
  auVar89 = vpbroadcastd_avx512vl();
  auVar85 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar9 * 0x10 + 6));
  auVar140._0_4_ = auVar77._0_4_ * auVar88._0_4_;
  auVar140._4_4_ = auVar77._4_4_ * auVar88._4_4_;
  auVar140._8_4_ = auVar77._8_4_ * auVar88._8_4_;
  auVar140._12_4_ = auVar77._12_4_ * auVar88._12_4_;
  auVar140._16_4_ = auVar88._16_4_ * 0.0;
  auVar140._20_4_ = auVar88._20_4_ * 0.0;
  auVar140._24_4_ = auVar88._24_4_ * 0.0;
  auVar140._28_4_ = 0;
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar9 * 0x10 + uVar66 * -2 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,ZEXT1632(auVar5));
  auVar97._4_4_ = auVar79._4_4_ * auVar88._4_4_;
  auVar97._0_4_ = auVar79._0_4_ * auVar88._0_4_;
  auVar97._8_4_ = auVar79._8_4_ * auVar88._8_4_;
  auVar97._12_4_ = auVar79._12_4_ * auVar88._12_4_;
  auVar97._16_4_ = auVar88._16_4_ * 0.0;
  auVar97._20_4_ = auVar88._20_4_ * 0.0;
  auVar97._24_4_ = auVar88._24_4_ * 0.0;
  auVar97._28_4_ = auVar88._28_4_;
  auVar88 = vcvtdq2ps_avx(auVar85);
  auVar88 = vsubps_avx(auVar88,ZEXT1632(auVar5));
  auVar137._0_4_ = auVar79._0_4_ * auVar88._0_4_;
  auVar137._4_4_ = auVar79._4_4_ * auVar88._4_4_;
  auVar137._8_4_ = auVar79._8_4_ * auVar88._8_4_;
  auVar137._12_4_ = auVar79._12_4_ * auVar88._12_4_;
  auVar137._16_4_ = auVar88._16_4_ * 0.0;
  auVar137._20_4_ = auVar88._20_4_ * 0.0;
  auVar137._24_4_ = auVar88._24_4_ * 0.0;
  auVar137._28_4_ = 0;
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 + uVar66 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,ZEXT1632(auVar6));
  auVar91._4_4_ = auVar88._4_4_ * auVar76._4_4_;
  auVar91._0_4_ = auVar88._0_4_ * auVar76._0_4_;
  auVar91._8_4_ = auVar88._8_4_ * auVar76._8_4_;
  auVar91._12_4_ = auVar88._12_4_ * auVar76._12_4_;
  auVar91._16_4_ = auVar88._16_4_ * 0.0;
  auVar91._20_4_ = auVar88._20_4_ * 0.0;
  auVar91._24_4_ = auVar88._24_4_ * 0.0;
  auVar91._28_4_ = auVar88._28_4_;
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar66 * 0x17 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar88 = vsubps_avx(auVar88,ZEXT1632(auVar6));
  auVar96._0_4_ = auVar76._0_4_ * auVar88._0_4_;
  auVar96._4_4_ = auVar76._4_4_ * auVar88._4_4_;
  auVar96._8_4_ = auVar76._8_4_ * auVar88._8_4_;
  auVar96._12_4_ = auVar76._12_4_ * auVar88._12_4_;
  auVar96._16_4_ = auVar88._16_4_ * 0.0;
  auVar96._20_4_ = auVar88._20_4_ * 0.0;
  auVar96._24_4_ = auVar88._24_4_ * 0.0;
  auVar96._28_4_ = 0;
  auVar88 = vpminsd_avx2(auVar98,auVar140);
  auVar85 = vpminsd_avx2(auVar97,auVar137);
  auVar88 = vmaxps_avx(auVar88,auVar85);
  auVar85 = vpminsd_avx2(auVar91,auVar96);
  uVar128 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar86._4_4_ = uVar128;
  auVar86._0_4_ = uVar128;
  auVar86._8_4_ = uVar128;
  auVar86._12_4_ = uVar128;
  auVar86._16_4_ = uVar128;
  auVar86._20_4_ = uVar128;
  auVar86._24_4_ = uVar128;
  auVar86._28_4_ = uVar128;
  auVar85 = vmaxps_avx512vl(auVar85,auVar86);
  auVar88 = vmaxps_avx(auVar88,auVar85);
  auVar85._8_4_ = 0x3f7ffffa;
  auVar85._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar85._12_4_ = 0x3f7ffffa;
  auVar85._16_4_ = 0x3f7ffffa;
  auVar85._20_4_ = 0x3f7ffffa;
  auVar85._24_4_ = 0x3f7ffffa;
  auVar85._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar88,auVar85);
  auVar88 = vpmaxsd_avx2(auVar98,auVar140);
  auVar85 = vpmaxsd_avx2(auVar97,auVar137);
  auVar88 = vminps_avx(auVar88,auVar85);
  auVar85 = vpmaxsd_avx2(auVar91,auVar96);
  uVar128 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar87._4_4_ = uVar128;
  auVar87._0_4_ = uVar128;
  auVar87._8_4_ = uVar128;
  auVar87._12_4_ = uVar128;
  auVar87._16_4_ = uVar128;
  auVar87._20_4_ = uVar128;
  auVar87._24_4_ = uVar128;
  auVar87._28_4_ = uVar128;
  auVar85 = vminps_avx512vl(auVar85,auVar87);
  auVar88 = vminps_avx(auVar88,auVar85);
  auVar90._8_4_ = 0x3f800003;
  auVar90._0_8_ = 0x3f8000033f800003;
  auVar90._12_4_ = 0x3f800003;
  auVar90._16_4_ = 0x3f800003;
  auVar90._20_4_ = 0x3f800003;
  auVar90._24_4_ = 0x3f800003;
  auVar90._28_4_ = 0x3f800003;
  auVar88 = vmulps_avx512vl(auVar88,auVar90);
  uVar18 = vpcmpgtd_avx512vl(auVar89,_DAT_01fe9900);
  uVar136 = vcmpps_avx512vl(local_80,auVar88,2);
  if ((byte)((byte)uVar136 & (byte)uVar18) == 0) {
    bVar72 = 0;
  }
  else {
    uVar68 = (ulong)(byte)((byte)uVar136 & (byte)uVar18);
    local_3a0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_5e0 = pre;
    do {
      lVar19 = 0;
      for (uVar66 = uVar68; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x8000000000000000) {
        lVar19 = lVar19 + 1;
      }
      uVar68 = uVar68 - 1 & uVar68;
      local_530._0_4_ = *(undefined4 *)(prim + lVar19 * 4 + 6);
      uVar66 = (ulong)(uint)((int)lVar19 << 6);
      local_5d8 = (ulong)*(uint *)(prim + 2);
      pGVar71 = (context->scene->geometries).items[local_5d8].ptr;
      local_5d0 = *(undefined1 (*) [16])(prim + uVar66 + lVar62 + 0x16);
      if (uVar68 != 0) {
        uVar69 = uVar68 - 1 & uVar68;
        for (uVar73 = uVar68; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x8000000000000000) {
        }
        if (uVar69 != 0) {
          for (; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000) {
          }
        }
      }
      local_510 = *(undefined1 (*) [16])(prim + uVar66 + lVar62 + 0x26);
      local_520 = *(undefined1 (*) [16])(prim + uVar66 + lVar62 + 0x36);
      _local_390 = *(undefined1 (*) [16])(prim + uVar66 + lVar62 + 0x46);
      local_460._0_8_ = pGVar71;
      iVar10 = (int)pGVar71[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar77 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10))
                              ,0x1c);
      auVar77 = vinsertps_avx(auVar77,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      auVar76 = vsubps_avx(local_5d0,auVar77);
      uVar128 = auVar76._0_4_;
      auVar80._4_4_ = uVar128;
      auVar80._0_4_ = uVar128;
      auVar80._8_4_ = uVar128;
      auVar80._12_4_ = uVar128;
      auVar79 = vshufps_avx(auVar76,auVar76,0x55);
      auVar76 = vshufps_avx(auVar76,auVar76,0xaa);
      aVar3 = pre->ray_space[k].vx.field_0;
      aVar4 = pre->ray_space[k].vy.field_0;
      fVar135 = pre->ray_space[k].vz.field_0.m128[0];
      fVar127 = pre->ray_space[k].vz.field_0.m128[1];
      fVar143 = pre->ray_space[k].vz.field_0.m128[2];
      fVar134 = pre->ray_space[k].vz.field_0.m128[3];
      auVar163._0_4_ = fVar135 * auVar76._0_4_;
      auVar163._4_4_ = fVar127 * auVar76._4_4_;
      auVar163._8_4_ = fVar143 * auVar76._8_4_;
      auVar163._12_4_ = fVar134 * auVar76._12_4_;
      auVar79 = vfmadd231ps_fma(auVar163,(undefined1  [16])aVar4,auVar79);
      auVar5 = vfmadd231ps_fma(auVar79,(undefined1  [16])aVar3,auVar80);
      auVar79 = vshufps_avx(local_5d0,local_5d0,0xff);
      auVar75 = vsubps_avx(local_510,auVar77);
      uVar128 = auVar75._0_4_;
      auVar144._4_4_ = uVar128;
      auVar144._0_4_ = uVar128;
      auVar144._8_4_ = uVar128;
      auVar144._12_4_ = uVar128;
      auVar76 = vshufps_avx(auVar75,auVar75,0x55);
      auVar75 = vshufps_avx(auVar75,auVar75,0xaa);
      auVar164._0_4_ = fVar135 * auVar75._0_4_;
      auVar164._4_4_ = fVar127 * auVar75._4_4_;
      auVar164._8_4_ = fVar143 * auVar75._8_4_;
      auVar164._12_4_ = fVar134 * auVar75._12_4_;
      auVar76 = vfmadd231ps_fma(auVar164,(undefined1  [16])aVar4,auVar76);
      auVar6 = vfmadd231ps_fma(auVar76,(undefined1  [16])aVar3,auVar144);
      auVar75 = vsubps_avx512vl(local_520,auVar77);
      uVar128 = auVar75._0_4_;
      auVar81._4_4_ = uVar128;
      auVar81._0_4_ = uVar128;
      auVar81._8_4_ = uVar128;
      auVar81._12_4_ = uVar128;
      auVar76 = vshufps_avx(auVar75,auVar75,0x55);
      auVar75 = vshufps_avx(auVar75,auVar75,0xaa);
      auVar166._0_4_ = fVar135 * auVar75._0_4_;
      auVar166._4_4_ = fVar127 * auVar75._4_4_;
      auVar166._8_4_ = fVar143 * auVar75._8_4_;
      auVar166._12_4_ = fVar134 * auVar75._12_4_;
      auVar76 = vfmadd231ps_fma(auVar166,(undefined1  [16])aVar4,auVar76);
      auVar75 = vfmadd231ps_fma(auVar76,(undefined1  [16])aVar3,auVar81);
      auVar76 = vsubps_avx512vl(_local_390,auVar77);
      uVar128 = auVar76._0_4_;
      auVar139._4_4_ = uVar128;
      auVar139._0_4_ = uVar128;
      auVar139._8_4_ = uVar128;
      auVar139._12_4_ = uVar128;
      auVar77 = vshufps_avx(auVar76,auVar76,0x55);
      auVar76 = vshufps_avx(auVar76,auVar76,0xaa);
      auVar167._0_4_ = fVar135 * auVar76._0_4_;
      auVar167._4_4_ = fVar127 * auVar76._4_4_;
      auVar167._8_4_ = fVar143 * auVar76._8_4_;
      auVar167._12_4_ = fVar134 * auVar76._12_4_;
      auVar77 = vfmadd231ps_fma(auVar167,(undefined1  [16])aVar4,auVar77);
      auVar76 = vfmadd231ps_fma(auVar77,(undefined1  [16])aVar3,auVar139);
      lVar19 = (long)iVar10 * 0x44;
      auVar88 = *(undefined1 (*) [32])(bspline_basis0 + lVar19);
      local_3c0 = vbroadcastss_avx512vl(auVar5);
      auVar133._8_4_ = 1;
      auVar133._0_8_ = 0x100000001;
      auVar133._12_4_ = 1;
      auVar133._16_4_ = 1;
      auVar133._20_4_ = 1;
      auVar133._24_4_ = 1;
      auVar133._28_4_ = 1;
      local_400 = vpermps_avx2(auVar133,ZEXT1632(auVar5));
      auVar85 = *(undefined1 (*) [32])(bspline_basis0 + lVar19 + 0x484);
      uVar128 = auVar6._0_4_;
      local_420._4_4_ = uVar128;
      local_420._0_4_ = uVar128;
      local_420._8_4_ = uVar128;
      local_420._12_4_ = uVar128;
      local_420._16_4_ = uVar128;
      local_420._20_4_ = uVar128;
      local_420._24_4_ = uVar128;
      local_420._28_4_ = uVar128;
      local_440 = vpermps_avx512vl(auVar133,ZEXT1632(auVar6));
      auVar86 = *(undefined1 (*) [32])(bspline_basis0 + lVar19 + 0x908);
      local_560 = vbroadcastss_avx512vl(auVar75);
      local_4c0 = vpermps_avx512vl(auVar133,ZEXT1632(auVar75));
      auVar183 = ZEXT3264(local_4c0);
      auVar87 = *(undefined1 (*) [32])(bspline_basis0 + lVar19 + 0xd8c);
      local_4e0 = vbroadcastss_avx512vl(auVar76);
      auVar186 = ZEXT3264(local_4e0);
      local_500 = vpermps_avx512vl(auVar133,ZEXT1632(auVar76));
      auVar184 = ZEXT3264(local_500);
      auVar90 = vmulps_avx512vl(local_4e0,auVar87);
      auVar89 = vmulps_avx512vl(local_500,auVar87);
      auVar90 = vfmadd231ps_avx512vl(auVar90,auVar86,local_560);
      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar86,local_4c0);
      auVar77 = vfmadd231ps_fma(auVar90,auVar85,local_420);
      auVar90 = vfmadd231ps_avx512vl(auVar89,auVar85,local_440);
      auVar91 = vfmadd231ps_avx512vl(ZEXT1632(auVar77),auVar88,local_3c0);
      auVar92 = vfmadd231ps_avx512vl(auVar90,auVar88,local_400);
      auVar90 = *(undefined1 (*) [32])(bspline_basis1 + lVar19);
      auVar89 = *(undefined1 (*) [32])(bspline_basis1 + lVar19 + 0x484);
      auVar98 = *(undefined1 (*) [32])(bspline_basis1 + lVar19 + 0x908);
      auVar97 = *(undefined1 (*) [32])(bspline_basis1 + lVar19 + 0xd8c);
      auVar84 = vmulps_avx512vl(local_4e0,auVar97);
      auVar93 = vmulps_avx512vl(local_500,auVar97);
      auVar84 = vfmadd231ps_avx512vl(auVar84,auVar98,local_560);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar98,local_4c0);
      auVar84 = vfmadd231ps_avx512vl(auVar84,auVar89,local_420);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar89,local_440);
      auVar84 = vfmadd231ps_avx512vl(auVar84,auVar90,local_3c0);
      auVar7 = vfmadd231ps_fma(auVar93,auVar90,local_400);
      auVar93 = vsubps_avx512vl(auVar84,auVar91);
      auVar94 = vsubps_avx512vl(ZEXT1632(auVar7),auVar92);
      auVar82 = vmulps_avx512vl(auVar92,auVar93);
      auVar83 = vmulps_avx512vl(auVar91,auVar94);
      auVar82 = vsubps_avx512vl(auVar82,auVar83);
      auVar77 = vshufps_avx(local_510,local_510,0xff);
      uVar136 = auVar79._0_8_;
      local_a0._8_8_ = uVar136;
      local_a0._0_8_ = uVar136;
      local_a0._16_8_ = uVar136;
      local_a0._24_8_ = uVar136;
      local_c0 = vbroadcastsd_avx512vl(auVar77);
      auVar77 = vshufps_avx512vl(local_520,local_520,0xff);
      local_e0 = vbroadcastsd_avx512vl(auVar77);
      auVar77 = vshufps_avx512vl(_local_390,_local_390,0xff);
      uVar136 = auVar77._0_8_;
      register0x000012c8 = uVar136;
      local_100 = uVar136;
      register0x000012d0 = uVar136;
      register0x000012d8 = uVar136;
      auVar83 = vmulps_avx512vl(_local_100,auVar87);
      auVar83 = vfmadd231ps_avx512vl(auVar83,auVar86,local_e0);
      auVar83 = vfmadd231ps_avx512vl(auVar83,auVar85,local_c0);
      auVar83 = vfmadd231ps_avx512vl(auVar83,auVar88,local_a0);
      auVar95 = vmulps_avx512vl(_local_100,auVar97);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar98,local_e0);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar89,local_c0);
      auVar8 = vfmadd231ps_fma(auVar95,auVar90,local_a0);
      auVar95 = vmulps_avx512vl(auVar94,auVar94);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar93,auVar93);
      auVar96 = vmaxps_avx512vl(auVar83,ZEXT1632(auVar8));
      auVar96 = vmulps_avx512vl(auVar96,auVar96);
      auVar95 = vmulps_avx512vl(auVar96,auVar95);
      auVar82 = vmulps_avx512vl(auVar82,auVar82);
      uVar136 = vcmpps_avx512vl(auVar82,auVar95,2);
      auVar77 = vblendps_avx(auVar5,local_5d0,8);
      auVar78 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar79 = vandps_avx512vl(auVar77,auVar78);
      auVar77 = vblendps_avx(auVar6,local_510,8);
      auVar77 = vandps_avx512vl(auVar77,auVar78);
      auVar79 = vmaxps_avx(auVar79,auVar77);
      auVar77 = vblendps_avx(auVar75,local_520,8);
      auVar80 = vandps_avx512vl(auVar77,auVar78);
      auVar77 = vblendps_avx(auVar76,_local_390,8);
      auVar77 = vandps_avx512vl(auVar77,auVar78);
      auVar77 = vmaxps_avx(auVar80,auVar77);
      auVar77 = vmaxps_avx(auVar79,auVar77);
      auVar79 = vmovshdup_avx(auVar77);
      auVar79 = vmaxss_avx(auVar79,auVar77);
      auVar77 = vshufpd_avx(auVar77,auVar77,1);
      auVar77 = vmaxss_avx(auVar77,auVar79);
      local_540 = vcvtsi2ss_avx512f(local_520,iVar10);
      auVar168._0_4_ = local_540._0_4_;
      auVar168._4_4_ = auVar168._0_4_;
      auVar168._8_4_ = auVar168._0_4_;
      auVar168._12_4_ = auVar168._0_4_;
      auVar168._16_4_ = auVar168._0_4_;
      auVar168._20_4_ = auVar168._0_4_;
      auVar168._24_4_ = auVar168._0_4_;
      auVar168._28_4_ = auVar168._0_4_;
      uVar18 = vcmpps_avx512vl(auVar168,_DAT_01faff40,0xe);
      bVar72 = (byte)uVar136 & (byte)uVar18;
      fVar127 = auVar77._0_4_ * 4.7683716e-07;
      auVar141._8_4_ = 2;
      auVar141._0_8_ = 0x200000002;
      auVar141._12_4_ = 2;
      auVar141._16_4_ = 2;
      auVar141._20_4_ = 2;
      auVar141._24_4_ = 2;
      auVar141._28_4_ = 2;
      local_120 = vpermps_avx512vl(auVar141,ZEXT1632(auVar5));
      local_140 = vpermps_avx512vl(auVar141,ZEXT1632(auVar6));
      local_160 = vpermps_avx512vl(auVar141,ZEXT1632(auVar75));
      local_4a0 = vpermps_avx2(auVar141,ZEXT1632(auVar76));
      fVar135 = *(float *)(ray + k * 4 + 0x30);
      auVar77 = auVar94._0_16_;
      if (bVar72 == 0) {
        uVar66 = 0;
        auVar77 = vxorps_avx512vl(auVar77,auVar77);
        auVar182 = ZEXT1664(auVar77);
        auVar179 = ZEXT3264(local_3c0);
        auVar180 = ZEXT3264(local_400);
        auVar88 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar185 = ZEXT3264(auVar88);
        auVar181 = ZEXT3264(local_420);
        auVar177 = ZEXT3264(local_440);
        auVar178 = ZEXT3264(local_560);
      }
      else {
        fStack_47c = 0.0;
        fStack_478 = 0.0;
        fStack_474 = 0.0;
        auVar97 = vmulps_avx512vl(local_4a0,auVar97);
        auVar98 = vfmadd213ps_avx512vl(auVar98,local_160,auVar97);
        auVar89 = vfmadd213ps_avx512vl(auVar89,local_140,auVar98);
        auVar89 = vfmadd213ps_avx512vl(auVar90,local_120,auVar89);
        auVar87 = vmulps_avx512vl(local_4a0,auVar87);
        auVar86 = vfmadd213ps_avx512vl(auVar86,local_160,auVar87);
        auVar98 = vfmadd213ps_avx512vl(auVar85,local_140,auVar86);
        auVar85 = *(undefined1 (*) [32])(bspline_basis0 + lVar19 + 0x1210);
        auVar86 = *(undefined1 (*) [32])(bspline_basis0 + lVar19 + 0x1694);
        auVar87 = *(undefined1 (*) [32])(bspline_basis0 + lVar19 + 0x1b18);
        auVar90 = *(undefined1 (*) [32])(bspline_basis0 + lVar19 + 0x1f9c);
        auVar98 = vfmadd213ps_avx512vl(auVar88,local_120,auVar98);
        auVar88 = vmulps_avx512vl(local_4e0,auVar90);
        auVar97 = vmulps_avx512vl(local_500,auVar90);
        auVar90 = vmulps_avx512vl(local_4a0,auVar90);
        auVar178 = ZEXT3264(local_560);
        auVar88 = vfmadd231ps_avx512vl(auVar88,auVar87,local_560);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar87,local_4c0);
        auVar87 = vfmadd231ps_avx512vl(auVar90,local_160,auVar87);
        auVar88 = vfmadd231ps_avx512vl(auVar88,auVar86,local_420);
        auVar90 = vfmadd231ps_avx512vl(auVar97,auVar86,local_440);
        auVar97 = vfmadd231ps_avx512vl(auVar87,local_140,auVar86);
        auVar79 = vfmadd231ps_fma(auVar88,auVar85,local_3c0);
        auVar90 = vfmadd231ps_avx512vl(auVar90,auVar85,local_400);
        auVar88 = *(undefined1 (*) [32])(bspline_basis1 + lVar19 + 0x1210);
        auVar86 = *(undefined1 (*) [32])(bspline_basis1 + lVar19 + 0x1b18);
        auVar87 = *(undefined1 (*) [32])(bspline_basis1 + lVar19 + 0x1f9c);
        auVar97 = vfmadd231ps_avx512vl(auVar97,local_120,auVar85);
        auVar85 = vmulps_avx512vl(local_4e0,auVar87);
        auVar82 = vmulps_avx512vl(local_500,auVar87);
        auVar87 = vmulps_avx512vl(local_4a0,auVar87);
        auVar95 = vfmadd231ps_avx512vl(auVar85,auVar86,local_560);
        auVar82 = vfmadd231ps_avx512vl(auVar82,auVar86,local_4c0);
        auVar86 = vfmadd231ps_avx512vl(auVar87,local_160,auVar86);
        auVar85 = *(undefined1 (*) [32])(bspline_basis1 + lVar19 + 0x1694);
        auVar87 = vfmadd231ps_avx512vl(auVar95,auVar85,local_420);
        auVar82 = vfmadd231ps_avx512vl(auVar82,auVar85,local_440);
        auVar85 = vfmadd231ps_avx512vl(auVar86,local_140,auVar85);
        auVar76 = vfmadd231ps_fma(auVar87,auVar88,local_3c0);
        auVar86 = vfmadd231ps_avx512vl(auVar82,auVar88,local_400);
        auVar87 = vfmadd231ps_avx512vl(auVar85,local_120,auVar88);
        auVar175._8_4_ = 0x7fffffff;
        auVar175._0_8_ = 0x7fffffff7fffffff;
        auVar175._12_4_ = 0x7fffffff;
        auVar175._16_4_ = 0x7fffffff;
        auVar175._20_4_ = 0x7fffffff;
        auVar175._24_4_ = 0x7fffffff;
        auVar175._28_4_ = 0x7fffffff;
        auVar88 = vandps_avx(ZEXT1632(auVar79),auVar175);
        auVar85 = vandps_avx(auVar90,auVar175);
        auVar85 = vmaxps_avx(auVar88,auVar85);
        auVar88 = vandps_avx(auVar97,auVar175);
        auVar88 = vmaxps_avx(auVar85,auVar88);
        auVar97 = vbroadcastss_avx512vl(ZEXT416((uint)fVar127));
        uVar66 = vcmpps_avx512vl(auVar88,auVar97,1);
        bVar12 = (bool)((byte)uVar66 & 1);
        auVar99._0_4_ = (float)((uint)bVar12 * auVar93._0_4_ | (uint)!bVar12 * auVar79._0_4_);
        bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
        auVar99._4_4_ = (float)((uint)bVar12 * auVar93._4_4_ | (uint)!bVar12 * auVar79._4_4_);
        bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
        auVar99._8_4_ = (float)((uint)bVar12 * auVar93._8_4_ | (uint)!bVar12 * auVar79._8_4_);
        bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
        auVar99._12_4_ = (float)((uint)bVar12 * auVar93._12_4_ | (uint)!bVar12 * auVar79._12_4_);
        fVar134 = (float)((uint)((byte)(uVar66 >> 4) & 1) * auVar93._16_4_);
        auVar99._16_4_ = fVar134;
        fVar143 = (float)((uint)((byte)(uVar66 >> 5) & 1) * auVar93._20_4_);
        auVar99._20_4_ = fVar143;
        fVar156 = (float)((uint)((byte)(uVar66 >> 6) & 1) * auVar93._24_4_);
        auVar99._24_4_ = fVar156;
        uVar67 = (uint)(byte)(uVar66 >> 7) * auVar93._28_4_;
        auVar99._28_4_ = uVar67;
        bVar12 = (bool)((byte)uVar66 & 1);
        auVar100._0_4_ = (float)((uint)bVar12 * auVar94._0_4_ | (uint)!bVar12 * auVar90._0_4_);
        bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
        auVar100._4_4_ = (float)((uint)bVar12 * auVar94._4_4_ | (uint)!bVar12 * auVar90._4_4_);
        bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
        auVar100._8_4_ = (float)((uint)bVar12 * auVar94._8_4_ | (uint)!bVar12 * auVar90._8_4_);
        bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
        auVar100._12_4_ = (float)((uint)bVar12 * auVar94._12_4_ | (uint)!bVar12 * auVar90._12_4_);
        bVar12 = (bool)((byte)(uVar66 >> 4) & 1);
        auVar100._16_4_ = (float)((uint)bVar12 * auVar94._16_4_ | (uint)!bVar12 * auVar90._16_4_);
        bVar12 = (bool)((byte)(uVar66 >> 5) & 1);
        auVar100._20_4_ = (float)((uint)bVar12 * auVar94._20_4_ | (uint)!bVar12 * auVar90._20_4_);
        bVar12 = (bool)((byte)(uVar66 >> 6) & 1);
        auVar100._24_4_ = (float)((uint)bVar12 * auVar94._24_4_ | (uint)!bVar12 * auVar90._24_4_);
        bVar12 = SUB81(uVar66 >> 7,0);
        auVar100._28_4_ = (uint)bVar12 * auVar94._28_4_ | (uint)!bVar12 * auVar90._28_4_;
        auVar88 = vandps_avx(auVar175,ZEXT1632(auVar76));
        auVar85 = vandps_avx(auVar86,auVar175);
        auVar85 = vmaxps_avx(auVar88,auVar85);
        auVar88 = vandps_avx(auVar87,auVar175);
        auVar88 = vmaxps_avx(auVar85,auVar88);
        uVar66 = vcmpps_avx512vl(auVar88,auVar97,1);
        bVar12 = (bool)((byte)uVar66 & 1);
        auVar101._0_4_ = (float)((uint)bVar12 * auVar93._0_4_ | (uint)!bVar12 * auVar76._0_4_);
        bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
        auVar101._4_4_ = (float)((uint)bVar12 * auVar93._4_4_ | (uint)!bVar12 * auVar76._4_4_);
        bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
        auVar101._8_4_ = (float)((uint)bVar12 * auVar93._8_4_ | (uint)!bVar12 * auVar76._8_4_);
        bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
        auVar101._12_4_ = (float)((uint)bVar12 * auVar93._12_4_ | (uint)!bVar12 * auVar76._12_4_);
        fVar159 = (float)((uint)((byte)(uVar66 >> 4) & 1) * auVar93._16_4_);
        auVar101._16_4_ = fVar159;
        fVar155 = (float)((uint)((byte)(uVar66 >> 5) & 1) * auVar93._20_4_);
        auVar101._20_4_ = fVar155;
        fVar158 = (float)((uint)((byte)(uVar66 >> 6) & 1) * auVar93._24_4_);
        auVar101._24_4_ = fVar158;
        auVar101._28_4_ = (uint)(byte)(uVar66 >> 7) * auVar93._28_4_;
        bVar12 = (bool)((byte)uVar66 & 1);
        auVar102._0_4_ = (float)((uint)bVar12 * auVar94._0_4_ | (uint)!bVar12 * auVar86._0_4_);
        bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
        auVar102._4_4_ = (float)((uint)bVar12 * auVar94._4_4_ | (uint)!bVar12 * auVar86._4_4_);
        bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
        auVar102._8_4_ = (float)((uint)bVar12 * auVar94._8_4_ | (uint)!bVar12 * auVar86._8_4_);
        bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
        auVar102._12_4_ = (float)((uint)bVar12 * auVar94._12_4_ | (uint)!bVar12 * auVar86._12_4_);
        bVar12 = (bool)((byte)(uVar66 >> 4) & 1);
        auVar102._16_4_ = (float)((uint)bVar12 * auVar94._16_4_ | (uint)!bVar12 * auVar86._16_4_);
        bVar12 = (bool)((byte)(uVar66 >> 5) & 1);
        auVar102._20_4_ = (float)((uint)bVar12 * auVar94._20_4_ | (uint)!bVar12 * auVar86._20_4_);
        bVar12 = (bool)((byte)(uVar66 >> 6) & 1);
        auVar102._24_4_ = (float)((uint)bVar12 * auVar94._24_4_ | (uint)!bVar12 * auVar86._24_4_);
        bVar12 = SUB81(uVar66 >> 7,0);
        auVar102._28_4_ = (uint)bVar12 * auVar94._28_4_ | (uint)!bVar12 * auVar86._28_4_;
        auVar81 = vxorps_avx512vl(auVar77,auVar77);
        auVar182 = ZEXT1664(auVar81);
        auVar88 = vfmadd213ps_avx512vl(auVar99,auVar99,ZEXT1632(auVar81));
        auVar77 = vfmadd231ps_fma(auVar88,auVar100,auVar100);
        auVar88 = vrsqrt14ps_avx512vl(ZEXT1632(auVar77));
        fVar142 = auVar88._0_4_;
        fVar74 = auVar88._4_4_;
        fVar120 = auVar88._8_4_;
        fVar121 = auVar88._12_4_;
        fVar122 = auVar88._16_4_;
        fVar123 = auVar88._20_4_;
        fVar124 = auVar88._24_4_;
        auVar28._4_4_ = fVar74 * fVar74 * fVar74 * auVar77._4_4_ * -0.5;
        auVar28._0_4_ = fVar142 * fVar142 * fVar142 * auVar77._0_4_ * -0.5;
        auVar28._8_4_ = fVar120 * fVar120 * fVar120 * auVar77._8_4_ * -0.5;
        auVar28._12_4_ = fVar121 * fVar121 * fVar121 * auVar77._12_4_ * -0.5;
        auVar28._16_4_ = fVar122 * fVar122 * fVar122 * -0.0;
        auVar28._20_4_ = fVar123 * fVar123 * fVar123 * -0.0;
        auVar28._24_4_ = fVar124 * fVar124 * fVar124 * -0.0;
        auVar28._28_4_ = 0;
        auVar85 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar86 = vfmadd231ps_avx512vl(auVar28,auVar85,auVar88);
        auVar29._4_4_ = auVar100._4_4_ * auVar86._4_4_;
        auVar29._0_4_ = auVar100._0_4_ * auVar86._0_4_;
        auVar29._8_4_ = auVar100._8_4_ * auVar86._8_4_;
        auVar29._12_4_ = auVar100._12_4_ * auVar86._12_4_;
        auVar29._16_4_ = auVar100._16_4_ * auVar86._16_4_;
        auVar29._20_4_ = auVar100._20_4_ * auVar86._20_4_;
        auVar29._24_4_ = auVar100._24_4_ * auVar86._24_4_;
        auVar29._28_4_ = auVar88._28_4_;
        auVar30._4_4_ = auVar86._4_4_ * -auVar99._4_4_;
        auVar30._0_4_ = auVar86._0_4_ * -auVar99._0_4_;
        auVar30._8_4_ = auVar86._8_4_ * -auVar99._8_4_;
        auVar30._12_4_ = auVar86._12_4_ * -auVar99._12_4_;
        auVar30._16_4_ = auVar86._16_4_ * -fVar134;
        auVar30._20_4_ = auVar86._20_4_ * -fVar143;
        auVar30._24_4_ = auVar86._24_4_ * -fVar156;
        auVar30._28_4_ = uVar67 ^ 0x80000000;
        auVar88 = vmulps_avx512vl(auVar86,ZEXT1632(auVar81));
        auVar93 = ZEXT1632(auVar81);
        auVar87 = vfmadd213ps_avx512vl(auVar101,auVar101,auVar93);
        auVar77 = vfmadd231ps_fma(auVar87,auVar102,auVar102);
        auVar87 = vrsqrt14ps_avx512vl(ZEXT1632(auVar77));
        fVar143 = auVar87._0_4_;
        fVar134 = auVar87._4_4_;
        fVar156 = auVar87._8_4_;
        fVar142 = auVar87._12_4_;
        fVar74 = auVar87._16_4_;
        fVar120 = auVar87._20_4_;
        fVar121 = auVar87._24_4_;
        auVar31._4_4_ = fVar134 * fVar134 * fVar134 * auVar77._4_4_ * -0.5;
        auVar31._0_4_ = fVar143 * fVar143 * fVar143 * auVar77._0_4_ * -0.5;
        auVar31._8_4_ = fVar156 * fVar156 * fVar156 * auVar77._8_4_ * -0.5;
        auVar31._12_4_ = fVar142 * fVar142 * fVar142 * auVar77._12_4_ * -0.5;
        auVar31._16_4_ = fVar74 * fVar74 * fVar74 * -0.0;
        auVar31._20_4_ = fVar120 * fVar120 * fVar120 * -0.0;
        auVar31._24_4_ = fVar121 * fVar121 * fVar121 * -0.0;
        auVar31._28_4_ = 0;
        auVar85 = vfmadd231ps_avx512vl(auVar31,auVar85,auVar87);
        auVar32._4_4_ = auVar102._4_4_ * auVar85._4_4_;
        auVar32._0_4_ = auVar102._0_4_ * auVar85._0_4_;
        auVar32._8_4_ = auVar102._8_4_ * auVar85._8_4_;
        auVar32._12_4_ = auVar102._12_4_ * auVar85._12_4_;
        auVar32._16_4_ = auVar102._16_4_ * auVar85._16_4_;
        auVar32._20_4_ = auVar102._20_4_ * auVar85._20_4_;
        auVar32._24_4_ = auVar102._24_4_ * auVar85._24_4_;
        auVar32._28_4_ = auVar87._28_4_;
        auVar33._4_4_ = -auVar101._4_4_ * auVar85._4_4_;
        auVar33._0_4_ = -auVar101._0_4_ * auVar85._0_4_;
        auVar33._8_4_ = -auVar101._8_4_ * auVar85._8_4_;
        auVar33._12_4_ = -auVar101._12_4_ * auVar85._12_4_;
        auVar33._16_4_ = -fVar159 * auVar85._16_4_;
        auVar33._20_4_ = -fVar155 * auVar85._20_4_;
        auVar33._24_4_ = -fVar158 * auVar85._24_4_;
        auVar33._28_4_ = auVar86._28_4_;
        auVar85 = vmulps_avx512vl(auVar85,auVar93);
        auVar77 = vfmadd213ps_fma(auVar29,auVar83,auVar91);
        auVar79 = vfmadd213ps_fma(auVar30,auVar83,auVar92);
        auVar86 = vfmadd213ps_avx512vl(auVar88,auVar83,auVar98);
        auVar87 = vfmadd213ps_avx512vl(auVar32,ZEXT1632(auVar8),auVar84);
        auVar78 = vfnmadd213ps_fma(auVar29,auVar83,auVar91);
        auVar97 = ZEXT1632(auVar8);
        auVar76 = vfmadd213ps_fma(auVar33,auVar97,ZEXT1632(auVar7));
        auVar80 = vfnmadd213ps_fma(auVar30,auVar83,auVar92);
        auVar75 = vfmadd213ps_fma(auVar85,auVar97,auVar89);
        auVar90 = vfnmadd231ps_avx512vl(auVar98,auVar83,auVar88);
        auVar139 = vfnmadd213ps_fma(auVar32,auVar97,auVar84);
        auVar7 = vfnmadd213ps_fma(auVar33,auVar97,ZEXT1632(auVar7));
        auVar144 = vfnmadd231ps_fma(auVar89,ZEXT1632(auVar8),auVar85);
        auVar85 = vsubps_avx512vl(auVar87,ZEXT1632(auVar78));
        auVar88 = vsubps_avx(ZEXT1632(auVar76),ZEXT1632(auVar80));
        auVar89 = vsubps_avx512vl(ZEXT1632(auVar75),auVar90);
        auVar98 = vmulps_avx512vl(auVar88,auVar90);
        auVar5 = vfmsub231ps_fma(auVar98,ZEXT1632(auVar80),auVar89);
        auVar34._4_4_ = auVar78._4_4_ * auVar89._4_4_;
        auVar34._0_4_ = auVar78._0_4_ * auVar89._0_4_;
        auVar34._8_4_ = auVar78._8_4_ * auVar89._8_4_;
        auVar34._12_4_ = auVar78._12_4_ * auVar89._12_4_;
        auVar34._16_4_ = auVar89._16_4_ * 0.0;
        auVar34._20_4_ = auVar89._20_4_ * 0.0;
        auVar34._24_4_ = auVar89._24_4_ * 0.0;
        auVar34._28_4_ = auVar89._28_4_;
        auVar89 = vfmsub231ps_avx512vl(auVar34,auVar90,auVar85);
        auVar35._4_4_ = auVar80._4_4_ * auVar85._4_4_;
        auVar35._0_4_ = auVar80._0_4_ * auVar85._0_4_;
        auVar35._8_4_ = auVar80._8_4_ * auVar85._8_4_;
        auVar35._12_4_ = auVar80._12_4_ * auVar85._12_4_;
        auVar35._16_4_ = auVar85._16_4_ * 0.0;
        auVar35._20_4_ = auVar85._20_4_ * 0.0;
        auVar35._24_4_ = auVar85._24_4_ * 0.0;
        auVar35._28_4_ = auVar85._28_4_;
        auVar6 = vfmsub231ps_fma(auVar35,ZEXT1632(auVar78),auVar88);
        auVar88 = vfmadd231ps_avx512vl(ZEXT1632(auVar6),auVar93,auVar89);
        auVar88 = vfmadd231ps_avx512vl(auVar88,auVar93,ZEXT1632(auVar5));
        auVar94 = ZEXT1632(auVar81);
        uVar66 = vcmpps_avx512vl(auVar88,auVar94,2);
        bVar65 = (byte)uVar66;
        fVar142 = (float)((uint)(bVar65 & 1) * auVar77._0_4_ |
                         (uint)!(bool)(bVar65 & 1) * auVar139._0_4_);
        bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
        fVar120 = (float)((uint)bVar12 * auVar77._4_4_ | (uint)!bVar12 * auVar139._4_4_);
        bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
        fVar122 = (float)((uint)bVar12 * auVar77._8_4_ | (uint)!bVar12 * auVar139._8_4_);
        bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
        fVar124 = (float)((uint)bVar12 * auVar77._12_4_ | (uint)!bVar12 * auVar139._12_4_);
        auVar98 = ZEXT1632(CONCAT412(fVar124,CONCAT48(fVar122,CONCAT44(fVar120,fVar142))));
        fVar74 = (float)((uint)(bVar65 & 1) * auVar79._0_4_ |
                        (uint)!(bool)(bVar65 & 1) * auVar7._0_4_);
        bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
        fVar121 = (float)((uint)bVar12 * auVar79._4_4_ | (uint)!bVar12 * auVar7._4_4_);
        bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
        fVar123 = (float)((uint)bVar12 * auVar79._8_4_ | (uint)!bVar12 * auVar7._8_4_);
        bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
        fVar125 = (float)((uint)bVar12 * auVar79._12_4_ | (uint)!bVar12 * auVar7._12_4_);
        auVar97 = ZEXT1632(CONCAT412(fVar125,CONCAT48(fVar123,CONCAT44(fVar121,fVar74))));
        auVar103._0_4_ =
             (float)((uint)(bVar65 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar144._0_4_
                    );
        bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
        auVar103._4_4_ = (float)((uint)bVar12 * auVar86._4_4_ | (uint)!bVar12 * auVar144._4_4_);
        bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
        auVar103._8_4_ = (float)((uint)bVar12 * auVar86._8_4_ | (uint)!bVar12 * auVar144._8_4_);
        bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
        auVar103._12_4_ = (float)((uint)bVar12 * auVar86._12_4_ | (uint)!bVar12 * auVar144._12_4_);
        fVar143 = (float)((uint)((byte)(uVar66 >> 4) & 1) * auVar86._16_4_);
        auVar103._16_4_ = fVar143;
        fVar134 = (float)((uint)((byte)(uVar66 >> 5) & 1) * auVar86._20_4_);
        auVar103._20_4_ = fVar134;
        fVar156 = (float)((uint)((byte)(uVar66 >> 6) & 1) * auVar86._24_4_);
        auVar103._24_4_ = fVar156;
        iVar1 = (uint)(byte)(uVar66 >> 7) * auVar86._28_4_;
        auVar103._28_4_ = iVar1;
        auVar85 = vblendmps_avx512vl(ZEXT1632(auVar78),auVar87);
        auVar104._0_4_ =
             (uint)(bVar65 & 1) * auVar85._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar5._0_4_;
        bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
        auVar104._4_4_ = (uint)bVar12 * auVar85._4_4_ | (uint)!bVar12 * auVar5._4_4_;
        bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
        auVar104._8_4_ = (uint)bVar12 * auVar85._8_4_ | (uint)!bVar12 * auVar5._8_4_;
        bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
        auVar104._12_4_ = (uint)bVar12 * auVar85._12_4_ | (uint)!bVar12 * auVar5._12_4_;
        auVar104._16_4_ = (uint)((byte)(uVar66 >> 4) & 1) * auVar85._16_4_;
        auVar104._20_4_ = (uint)((byte)(uVar66 >> 5) & 1) * auVar85._20_4_;
        auVar104._24_4_ = (uint)((byte)(uVar66 >> 6) & 1) * auVar85._24_4_;
        auVar104._28_4_ = (uint)(byte)(uVar66 >> 7) * auVar85._28_4_;
        auVar85 = vblendmps_avx512vl(ZEXT1632(auVar80),ZEXT1632(auVar76));
        auVar105._0_4_ =
             (float)((uint)(bVar65 & 1) * auVar85._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar79._0_4_)
        ;
        bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
        auVar105._4_4_ = (float)((uint)bVar12 * auVar85._4_4_ | (uint)!bVar12 * auVar79._4_4_);
        bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
        auVar105._8_4_ = (float)((uint)bVar12 * auVar85._8_4_ | (uint)!bVar12 * auVar79._8_4_);
        bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
        auVar105._12_4_ = (float)((uint)bVar12 * auVar85._12_4_ | (uint)!bVar12 * auVar79._12_4_);
        fVar158 = (float)((uint)((byte)(uVar66 >> 4) & 1) * auVar85._16_4_);
        auVar105._16_4_ = fVar158;
        fVar155 = (float)((uint)((byte)(uVar66 >> 5) & 1) * auVar85._20_4_);
        auVar105._20_4_ = fVar155;
        fVar159 = (float)((uint)((byte)(uVar66 >> 6) & 1) * auVar85._24_4_);
        auVar105._24_4_ = fVar159;
        auVar105._28_4_ = (uint)(byte)(uVar66 >> 7) * auVar85._28_4_;
        auVar85 = vblendmps_avx512vl(auVar90,ZEXT1632(auVar75));
        auVar106._0_4_ =
             (float)((uint)(bVar65 & 1) * auVar85._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar86._0_4_)
        ;
        bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
        auVar106._4_4_ = (float)((uint)bVar12 * auVar85._4_4_ | (uint)!bVar12 * auVar86._4_4_);
        bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
        auVar106._8_4_ = (float)((uint)bVar12 * auVar85._8_4_ | (uint)!bVar12 * auVar86._8_4_);
        bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
        auVar106._12_4_ = (float)((uint)bVar12 * auVar85._12_4_ | (uint)!bVar12 * auVar86._12_4_);
        bVar12 = (bool)((byte)(uVar66 >> 4) & 1);
        auVar106._16_4_ = (float)((uint)bVar12 * auVar85._16_4_ | (uint)!bVar12 * auVar86._16_4_);
        bVar12 = (bool)((byte)(uVar66 >> 5) & 1);
        auVar106._20_4_ = (float)((uint)bVar12 * auVar85._20_4_ | (uint)!bVar12 * auVar86._20_4_);
        bVar12 = (bool)((byte)(uVar66 >> 6) & 1);
        auVar106._24_4_ = (float)((uint)bVar12 * auVar85._24_4_ | (uint)!bVar12 * auVar86._24_4_);
        bVar12 = SUB81(uVar66 >> 7,0);
        auVar106._28_4_ = (uint)bVar12 * auVar85._28_4_ | (uint)!bVar12 * auVar86._28_4_;
        auVar107._0_4_ =
             (uint)(bVar65 & 1) * (int)auVar78._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar87._0_4_;
        bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
        auVar107._4_4_ = (uint)bVar12 * (int)auVar78._4_4_ | (uint)!bVar12 * auVar87._4_4_;
        bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
        auVar107._8_4_ = (uint)bVar12 * (int)auVar78._8_4_ | (uint)!bVar12 * auVar87._8_4_;
        bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
        auVar107._12_4_ = (uint)bVar12 * (int)auVar78._12_4_ | (uint)!bVar12 * auVar87._12_4_;
        auVar107._16_4_ = (uint)!(bool)((byte)(uVar66 >> 4) & 1) * auVar87._16_4_;
        auVar107._20_4_ = (uint)!(bool)((byte)(uVar66 >> 5) & 1) * auVar87._20_4_;
        auVar107._24_4_ = (uint)!(bool)((byte)(uVar66 >> 6) & 1) * auVar87._24_4_;
        auVar107._28_4_ = (uint)!SUB81(uVar66 >> 7,0) * auVar87._28_4_;
        bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
        bVar14 = (bool)((byte)(uVar66 >> 2) & 1);
        bVar15 = (bool)((byte)(uVar66 >> 3) & 1);
        auVar108._0_4_ =
             (uint)(bVar65 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar75._0_4_;
        bVar13 = (bool)((byte)(uVar66 >> 1) & 1);
        auVar108._4_4_ = (uint)bVar13 * auVar90._4_4_ | (uint)!bVar13 * auVar75._4_4_;
        bVar13 = (bool)((byte)(uVar66 >> 2) & 1);
        auVar108._8_4_ = (uint)bVar13 * auVar90._8_4_ | (uint)!bVar13 * auVar75._8_4_;
        bVar13 = (bool)((byte)(uVar66 >> 3) & 1);
        auVar108._12_4_ = (uint)bVar13 * auVar90._12_4_ | (uint)!bVar13 * auVar75._12_4_;
        auVar108._16_4_ = (uint)((byte)(uVar66 >> 4) & 1) * auVar90._16_4_;
        auVar108._20_4_ = (uint)((byte)(uVar66 >> 5) & 1) * auVar90._20_4_;
        auVar108._24_4_ = (uint)((byte)(uVar66 >> 6) & 1) * auVar90._24_4_;
        iVar2 = (uint)(byte)(uVar66 >> 7) * auVar90._28_4_;
        auVar108._28_4_ = iVar2;
        auVar91 = vsubps_avx512vl(auVar107,auVar98);
        auVar85 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar80._12_4_ |
                                                (uint)!bVar15 * auVar76._12_4_,
                                                CONCAT48((uint)bVar14 * (int)auVar80._8_4_ |
                                                         (uint)!bVar14 * auVar76._8_4_,
                                                         CONCAT44((uint)bVar12 * (int)auVar80._4_4_
                                                                  | (uint)!bVar12 * auVar76._4_4_,
                                                                  (uint)(bVar65 & 1) *
                                                                  (int)auVar80._0_4_ |
                                                                  (uint)!(bool)(bVar65 & 1) *
                                                                  auVar76._0_4_)))),auVar97);
        auVar86 = vsubps_avx(auVar108,auVar103);
        auVar87 = vsubps_avx(auVar98,auVar104);
        auVar90 = vsubps_avx(auVar97,auVar105);
        auVar89 = vsubps_avx(auVar103,auVar106);
        auVar36._4_4_ = auVar86._4_4_ * fVar120;
        auVar36._0_4_ = auVar86._0_4_ * fVar142;
        auVar36._8_4_ = auVar86._8_4_ * fVar122;
        auVar36._12_4_ = auVar86._12_4_ * fVar124;
        auVar36._16_4_ = auVar86._16_4_ * 0.0;
        auVar36._20_4_ = auVar86._20_4_ * 0.0;
        auVar36._24_4_ = auVar86._24_4_ * 0.0;
        auVar36._28_4_ = iVar2;
        auVar77 = vfmsub231ps_fma(auVar36,auVar103,auVar91);
        auVar37._4_4_ = fVar121 * auVar91._4_4_;
        auVar37._0_4_ = fVar74 * auVar91._0_4_;
        auVar37._8_4_ = fVar123 * auVar91._8_4_;
        auVar37._12_4_ = fVar125 * auVar91._12_4_;
        auVar37._16_4_ = auVar91._16_4_ * 0.0;
        auVar37._20_4_ = auVar91._20_4_ * 0.0;
        auVar37._24_4_ = auVar91._24_4_ * 0.0;
        auVar37._28_4_ = auVar88._28_4_;
        auVar79 = vfmsub231ps_fma(auVar37,auVar98,auVar85);
        auVar88 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),auVar94,ZEXT1632(auVar77));
        auVar151._0_4_ = auVar85._0_4_ * auVar103._0_4_;
        auVar151._4_4_ = auVar85._4_4_ * auVar103._4_4_;
        auVar151._8_4_ = auVar85._8_4_ * auVar103._8_4_;
        auVar151._12_4_ = auVar85._12_4_ * auVar103._12_4_;
        auVar151._16_4_ = auVar85._16_4_ * fVar143;
        auVar151._20_4_ = auVar85._20_4_ * fVar134;
        auVar151._24_4_ = auVar85._24_4_ * fVar156;
        auVar151._28_4_ = 0;
        auVar77 = vfmsub231ps_fma(auVar151,auVar97,auVar86);
        auVar92 = vfmadd231ps_avx512vl(auVar88,auVar94,ZEXT1632(auVar77));
        auVar88 = vmulps_avx512vl(auVar89,auVar104);
        auVar88 = vfmsub231ps_avx512vl(auVar88,auVar87,auVar106);
        auVar38._4_4_ = auVar90._4_4_ * auVar106._4_4_;
        auVar38._0_4_ = auVar90._0_4_ * auVar106._0_4_;
        auVar38._8_4_ = auVar90._8_4_ * auVar106._8_4_;
        auVar38._12_4_ = auVar90._12_4_ * auVar106._12_4_;
        auVar38._16_4_ = auVar90._16_4_ * auVar106._16_4_;
        auVar38._20_4_ = auVar90._20_4_ * auVar106._20_4_;
        auVar38._24_4_ = auVar90._24_4_ * auVar106._24_4_;
        auVar38._28_4_ = auVar106._28_4_;
        auVar77 = vfmsub231ps_fma(auVar38,auVar105,auVar89);
        auVar152._0_4_ = auVar105._0_4_ * auVar87._0_4_;
        auVar152._4_4_ = auVar105._4_4_ * auVar87._4_4_;
        auVar152._8_4_ = auVar105._8_4_ * auVar87._8_4_;
        auVar152._12_4_ = auVar105._12_4_ * auVar87._12_4_;
        auVar152._16_4_ = fVar158 * auVar87._16_4_;
        auVar152._20_4_ = fVar155 * auVar87._20_4_;
        auVar152._24_4_ = fVar159 * auVar87._24_4_;
        auVar152._28_4_ = 0;
        auVar79 = vfmsub231ps_fma(auVar152,auVar90,auVar104);
        auVar88 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),auVar94,auVar88);
        auVar84 = vfmadd231ps_avx512vl(auVar88,auVar94,ZEXT1632(auVar77));
        auVar88 = vmaxps_avx(auVar92,auVar84);
        uVar136 = vcmpps_avx512vl(auVar88,auVar94,2);
        bVar72 = bVar72 & (byte)uVar136;
        auVar179 = ZEXT3264(local_3c0);
        auVar180 = ZEXT3264(local_400);
        auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar185 = ZEXT3264(auVar93);
        auVar181 = ZEXT3264(local_420);
        auVar177 = ZEXT3264(local_440);
        if (bVar72 == 0) {
          uVar66 = 0;
          auVar183 = ZEXT3264(local_4c0);
          auVar186 = ZEXT3264(local_4e0);
          auVar184 = ZEXT3264(local_500);
        }
        else {
          uVar128 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar171._4_4_ = uVar128;
          auVar171._0_4_ = uVar128;
          auVar171._8_4_ = uVar128;
          auVar171._12_4_ = uVar128;
          auVar171._16_4_ = uVar128;
          auVar171._20_4_ = uVar128;
          auVar171._24_4_ = uVar128;
          auVar171._28_4_ = uVar128;
          auVar173 = ZEXT3264(auVar171);
          auVar39._4_4_ = auVar89._4_4_ * auVar85._4_4_;
          auVar39._0_4_ = auVar89._0_4_ * auVar85._0_4_;
          auVar39._8_4_ = auVar89._8_4_ * auVar85._8_4_;
          auVar39._12_4_ = auVar89._12_4_ * auVar85._12_4_;
          auVar39._16_4_ = auVar89._16_4_ * auVar85._16_4_;
          auVar39._20_4_ = auVar89._20_4_ * auVar85._20_4_;
          auVar39._24_4_ = auVar89._24_4_ * auVar85._24_4_;
          auVar39._28_4_ = auVar88._28_4_;
          auVar76 = vfmsub231ps_fma(auVar39,auVar90,auVar86);
          auVar40._4_4_ = auVar86._4_4_ * auVar87._4_4_;
          auVar40._0_4_ = auVar86._0_4_ * auVar87._0_4_;
          auVar40._8_4_ = auVar86._8_4_ * auVar87._8_4_;
          auVar40._12_4_ = auVar86._12_4_ * auVar87._12_4_;
          auVar40._16_4_ = auVar86._16_4_ * auVar87._16_4_;
          auVar40._20_4_ = auVar86._20_4_ * auVar87._20_4_;
          auVar40._24_4_ = auVar86._24_4_ * auVar87._24_4_;
          auVar40._28_4_ = auVar86._28_4_;
          auVar79 = vfmsub231ps_fma(auVar40,auVar91,auVar89);
          auVar41._4_4_ = auVar90._4_4_ * auVar91._4_4_;
          auVar41._0_4_ = auVar90._0_4_ * auVar91._0_4_;
          auVar41._8_4_ = auVar90._8_4_ * auVar91._8_4_;
          auVar41._12_4_ = auVar90._12_4_ * auVar91._12_4_;
          auVar41._16_4_ = auVar90._16_4_ * auVar91._16_4_;
          auVar41._20_4_ = auVar90._20_4_ * auVar91._20_4_;
          auVar41._24_4_ = auVar90._24_4_ * auVar91._24_4_;
          auVar41._28_4_ = auVar90._28_4_;
          auVar75 = vfmsub231ps_fma(auVar41,auVar87,auVar85);
          auVar77 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar79),ZEXT1632(auVar75));
          auVar88 = vfmadd231ps_avx512vl(ZEXT1632(auVar77),ZEXT1632(auVar76),auVar94);
          auVar85 = vrcp14ps_avx512vl(auVar88);
          auVar86 = vfnmadd213ps_avx512vl(auVar85,auVar88,auVar93);
          auVar77 = vfmadd132ps_fma(auVar86,auVar85,auVar85);
          auVar42._4_4_ = auVar75._4_4_ * auVar103._4_4_;
          auVar42._0_4_ = auVar75._0_4_ * auVar103._0_4_;
          auVar42._8_4_ = auVar75._8_4_ * auVar103._8_4_;
          auVar42._12_4_ = auVar75._12_4_ * auVar103._12_4_;
          auVar42._16_4_ = fVar143 * 0.0;
          auVar42._20_4_ = fVar134 * 0.0;
          auVar42._24_4_ = fVar156 * 0.0;
          auVar42._28_4_ = iVar1;
          auVar79 = vfmadd231ps_fma(auVar42,auVar97,ZEXT1632(auVar79));
          auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar98,ZEXT1632(auVar76));
          fVar143 = auVar77._0_4_;
          fVar134 = auVar77._4_4_;
          fVar156 = auVar77._8_4_;
          fVar159 = auVar77._12_4_;
          local_260 = ZEXT1632(CONCAT412(auVar79._12_4_ * fVar159,
                                         CONCAT48(auVar79._8_4_ * fVar156,
                                                  CONCAT44(auVar79._4_4_ * fVar134,
                                                           auVar79._0_4_ * fVar143))));
          auVar161._4_4_ = fVar135;
          auVar161._0_4_ = fVar135;
          auVar161._8_4_ = fVar135;
          auVar161._12_4_ = fVar135;
          auVar161._16_4_ = fVar135;
          auVar161._20_4_ = fVar135;
          auVar161._24_4_ = fVar135;
          auVar161._28_4_ = fVar135;
          uVar136 = vcmpps_avx512vl(local_260,auVar171,2);
          uVar18 = vcmpps_avx512vl(auVar161,local_260,2);
          bVar72 = (byte)uVar136 & (byte)uVar18 & bVar72;
          auVar183 = ZEXT3264(local_4c0);
          auVar186 = ZEXT3264(local_4e0);
          auVar184 = ZEXT3264(local_500);
          if (bVar72 == 0) {
            uVar66 = 0;
          }
          else {
            uVar136 = vcmpps_avx512vl(auVar88,auVar94,4);
            bVar72 = bVar72 & (byte)uVar136;
            auVar162 = ZEXT1664(local_5d0);
            if (bVar72 != 0) {
              fVar155 = auVar92._0_4_ * fVar143;
              fVar158 = auVar92._4_4_ * fVar134;
              auVar43._4_4_ = fVar158;
              auVar43._0_4_ = fVar155;
              fVar142 = auVar92._8_4_ * fVar156;
              auVar43._8_4_ = fVar142;
              fVar74 = auVar92._12_4_ * fVar159;
              auVar43._12_4_ = fVar74;
              fVar120 = auVar92._16_4_ * 0.0;
              auVar43._16_4_ = fVar120;
              fVar121 = auVar92._20_4_ * 0.0;
              auVar43._20_4_ = fVar121;
              fVar122 = auVar92._24_4_ * 0.0;
              auVar43._24_4_ = fVar122;
              auVar43._28_4_ = auVar88._28_4_;
              auVar85 = vsubps_avx512vl(auVar93,auVar43);
              local_2a0._0_4_ =
                   (float)((uint)(bVar65 & 1) * (int)fVar155 |
                          (uint)!(bool)(bVar65 & 1) * auVar85._0_4_);
              bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
              local_2a0._4_4_ = (float)((uint)bVar12 * (int)fVar158 | (uint)!bVar12 * auVar85._4_4_)
              ;
              bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
              local_2a0._8_4_ = (float)((uint)bVar12 * (int)fVar142 | (uint)!bVar12 * auVar85._8_4_)
              ;
              bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
              local_2a0._12_4_ =
                   (float)((uint)bVar12 * (int)fVar74 | (uint)!bVar12 * auVar85._12_4_);
              bVar12 = (bool)((byte)(uVar66 >> 4) & 1);
              local_2a0._16_4_ =
                   (float)((uint)bVar12 * (int)fVar120 | (uint)!bVar12 * auVar85._16_4_);
              bVar12 = (bool)((byte)(uVar66 >> 5) & 1);
              local_2a0._20_4_ =
                   (float)((uint)bVar12 * (int)fVar121 | (uint)!bVar12 * auVar85._20_4_);
              bVar12 = (bool)((byte)(uVar66 >> 6) & 1);
              local_2a0._24_4_ =
                   (float)((uint)bVar12 * (int)fVar122 | (uint)!bVar12 * auVar85._24_4_);
              bVar12 = SUB81(uVar66 >> 7,0);
              local_2a0._28_4_ =
                   (float)((uint)bVar12 * auVar88._28_4_ | (uint)!bVar12 * auVar85._28_4_);
              auVar88 = vsubps_avx(ZEXT1632(auVar8),auVar83);
              auVar77 = vfmadd213ps_fma(auVar88,local_2a0,auVar83);
              uVar128 = *(undefined4 *)((long)local_5e0->ray_space + k * 4 + -0x10);
              auVar23._4_4_ = uVar128;
              auVar23._0_4_ = uVar128;
              auVar23._8_4_ = uVar128;
              auVar23._12_4_ = uVar128;
              auVar23._16_4_ = uVar128;
              auVar23._20_4_ = uVar128;
              auVar23._24_4_ = uVar128;
              auVar23._28_4_ = uVar128;
              auVar88 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar77._12_4_ + auVar77._12_4_,
                                                           CONCAT48(auVar77._8_4_ + auVar77._8_4_,
                                                                    CONCAT44(auVar77._4_4_ +
                                                                             auVar77._4_4_,
                                                                             auVar77._0_4_ +
                                                                             auVar77._0_4_)))),
                                        auVar23);
              uVar136 = vcmpps_avx512vl(local_260,auVar88,6);
              if (((byte)uVar136 & bVar72) != 0) {
                auVar145._0_4_ = auVar84._0_4_ * fVar143;
                auVar145._4_4_ = auVar84._4_4_ * fVar134;
                auVar145._8_4_ = auVar84._8_4_ * fVar156;
                auVar145._12_4_ = auVar84._12_4_ * fVar159;
                auVar145._16_4_ = auVar84._16_4_ * 0.0;
                auVar145._20_4_ = auVar84._20_4_ * 0.0;
                auVar145._24_4_ = auVar84._24_4_ * 0.0;
                auVar145._28_4_ = 0;
                auVar88 = vsubps_avx512vl(auVar93,auVar145);
                auVar109._0_4_ =
                     (uint)(bVar65 & 1) * (int)auVar145._0_4_ |
                     (uint)!(bool)(bVar65 & 1) * auVar88._0_4_;
                bVar12 = (bool)((byte)(uVar66 >> 1) & 1);
                auVar109._4_4_ = (uint)bVar12 * (int)auVar145._4_4_ | (uint)!bVar12 * auVar88._4_4_;
                bVar12 = (bool)((byte)(uVar66 >> 2) & 1);
                auVar109._8_4_ = (uint)bVar12 * (int)auVar145._8_4_ | (uint)!bVar12 * auVar88._8_4_;
                bVar12 = (bool)((byte)(uVar66 >> 3) & 1);
                auVar109._12_4_ =
                     (uint)bVar12 * (int)auVar145._12_4_ | (uint)!bVar12 * auVar88._12_4_;
                bVar12 = (bool)((byte)(uVar66 >> 4) & 1);
                auVar109._16_4_ =
                     (uint)bVar12 * (int)auVar145._16_4_ | (uint)!bVar12 * auVar88._16_4_;
                bVar12 = (bool)((byte)(uVar66 >> 5) & 1);
                auVar109._20_4_ =
                     (uint)bVar12 * (int)auVar145._20_4_ | (uint)!bVar12 * auVar88._20_4_;
                bVar12 = (bool)((byte)(uVar66 >> 6) & 1);
                auVar109._24_4_ =
                     (uint)bVar12 * (int)auVar145._24_4_ | (uint)!bVar12 * auVar88._24_4_;
                auVar109._28_4_ = (uint)!SUB81(uVar66 >> 7,0) * auVar88._28_4_;
                auVar24._8_4_ = 0x40000000;
                auVar24._0_8_ = 0x4000000040000000;
                auVar24._12_4_ = 0x40000000;
                auVar24._16_4_ = 0x40000000;
                auVar24._20_4_ = 0x40000000;
                auVar24._24_4_ = 0x40000000;
                auVar24._28_4_ = 0x40000000;
                local_280 = vfmsub132ps_avx512vl(auVar109,auVar93,auVar24);
                local_240 = 0;
                local_220 = local_510._0_8_;
                uStack_218 = local_510._8_8_;
                local_210 = local_520._0_8_;
                uStack_208 = local_520._8_8_;
                if ((pGVar71->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (uVar66 = CONCAT71((int7)((ulong)pGVar71 >> 8),1),
                     pGVar71->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar143 = 1.0 / auVar168._0_4_;
                    local_1e0[0] = fVar143 * (local_2a0._0_4_ + 0.0);
                    local_1e0[1] = fVar143 * (local_2a0._4_4_ + 1.0);
                    local_1e0[2] = fVar143 * (local_2a0._8_4_ + 2.0);
                    local_1e0[3] = fVar143 * (local_2a0._12_4_ + 3.0);
                    fStack_1d0 = fVar143 * (local_2a0._16_4_ + 4.0);
                    fStack_1cc = fVar143 * (local_2a0._20_4_ + 5.0);
                    fStack_1c8 = fVar143 * (local_2a0._24_4_ + 6.0);
                    fStack_1c4 = local_2a0._28_4_ + 7.0;
                    local_1c0 = local_280;
                    local_1a0 = local_260;
                    uVar73 = 0;
                    local_380 = (ulong)((byte)uVar136 & bVar72);
                    for (uVar66 = local_380; (uVar66 & 1) == 0;
                        uVar66 = uVar66 >> 1 | 0x8000000000000000) {
                      uVar73 = uVar73 + 1;
                    }
                    local_5b0 = vpbroadcastd_avx512vl();
                    local_5c0 = vpbroadcastd_avx512vl();
                    uVar66 = uVar73;
                    local_480 = fVar135;
                    local_3e0 = auVar171;
                    local_23c = iVar10;
                    local_230 = local_5d0;
                    do {
                      auVar75 = auVar182._0_16_;
                      fVar143 = local_1e0[uVar73];
                      local_320._4_4_ = fVar143;
                      local_320._0_4_ = fVar143;
                      local_320._8_4_ = fVar143;
                      local_320._12_4_ = fVar143;
                      local_2c0 = (uint)uVar73;
                      uStack_2bc = (undefined4)(uVar73 >> 0x20);
                      local_310 = *(undefined4 *)(local_1c0 + uVar73 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1a0 + uVar73 * 4);
                      local_590.context = context->user;
                      fVar134 = 1.0 - fVar143;
                      auVar21._8_4_ = 0x80000000;
                      auVar21._0_8_ = 0x8000000080000000;
                      auVar21._12_4_ = 0x80000000;
                      auVar76 = vxorps_avx512vl(ZEXT416((uint)fVar134),auVar21);
                      auVar77 = ZEXT416((uint)(fVar143 * fVar134 * 4.0));
                      auVar79 = vfnmsub213ss_fma(local_320,local_320,auVar77);
                      auVar77 = vfmadd213ss_fma(ZEXT416((uint)fVar134),ZEXT416((uint)fVar134),
                                                auVar77);
                      fVar134 = fVar134 * auVar76._0_4_ * 0.5;
                      fVar156 = auVar79._0_4_ * 0.5;
                      fVar159 = auVar77._0_4_ * 0.5;
                      fVar143 = fVar143 * fVar143 * 0.5;
                      auVar147._0_4_ = fVar143 * (float)local_390._0_4_;
                      auVar147._4_4_ = fVar143 * (float)local_390._4_4_;
                      auVar147._8_4_ = fVar143 * fStack_388;
                      auVar147._12_4_ = fVar143 * fStack_384;
                      auVar129._4_4_ = fVar159;
                      auVar129._0_4_ = fVar159;
                      auVar129._8_4_ = fVar159;
                      auVar129._12_4_ = fVar159;
                      auVar77 = vfmadd132ps_fma(auVar129,auVar147,local_520);
                      auVar148._4_4_ = fVar156;
                      auVar148._0_4_ = fVar156;
                      auVar148._8_4_ = fVar156;
                      auVar148._12_4_ = fVar156;
                      auVar77 = vfmadd132ps_fma(auVar148,auVar77,local_510);
                      auVar130._4_4_ = fVar134;
                      auVar130._0_4_ = fVar134;
                      auVar130._8_4_ = fVar134;
                      auVar130._12_4_ = fVar134;
                      auVar77 = vfmadd213ps_fma(auVar130,auVar162._0_16_,auVar77);
                      local_350 = auVar77._0_4_;
                      local_340 = vshufps_avx(auVar77,auVar77,0x55);
                      local_330 = vshufps_avx(auVar77,auVar77,0xaa);
                      local_300 = local_5c0._0_8_;
                      uStack_2f8 = local_5c0._8_8_;
                      local_2f0 = local_5b0;
                      vpcmpeqd_avx2(ZEXT1632(local_5b0),ZEXT1632(local_5b0));
                      uStack_2dc = (local_590.context)->instID[0];
                      local_2e0 = uStack_2dc;
                      uStack_2d8 = uStack_2dc;
                      uStack_2d4 = uStack_2dc;
                      uStack_2d0 = (local_590.context)->instPrimID[0];
                      uStack_2cc = uStack_2d0;
                      uStack_2c8 = uStack_2d0;
                      uStack_2c4 = uStack_2d0;
                      local_5f0 = local_3a0;
                      local_590.valid = (int *)local_5f0;
                      local_590.geometryUserPtr = *(void **)(local_460._0_8_ + 0x18);
                      local_590.hit = (RTCHitN *)&local_350;
                      local_590.N = 4;
                      local_590.ray = (RTCRayN *)ray;
                      uStack_34c = local_350;
                      uStack_348 = local_350;
                      uStack_344 = local_350;
                      uStack_30c = local_310;
                      uStack_308 = local_310;
                      uStack_304 = local_310;
                      if (*(code **)(local_460._0_8_ + 0x48) != (code *)0x0) {
                        (**(code **)(local_460._0_8_ + 0x48))(&local_590);
                        auVar173 = ZEXT3264(local_3e0);
                        auVar184 = ZEXT3264(local_500);
                        auVar186 = ZEXT3264(local_4e0);
                        auVar183 = ZEXT3264(local_4c0);
                        auVar178 = ZEXT3264(local_560);
                        auVar177 = ZEXT3264(local_440);
                        auVar181 = ZEXT3264(local_420);
                        auVar180 = ZEXT3264(local_400);
                        auVar179 = ZEXT3264(local_3c0);
                        auVar162 = ZEXT1664(local_5d0);
                        auVar77 = vxorps_avx512vl(auVar75,auVar75);
                        auVar182 = ZEXT1664(auVar77);
                        fVar135 = local_480;
                      }
                      auVar77 = auVar182._0_16_;
                      uVar73 = vptestmd_avx512vl(local_5f0,local_5f0);
                      if ((uVar73 & 0xf) == 0) {
                        auVar88 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar185 = ZEXT3264(auVar88);
                      }
                      else {
                        p_Var11 = context->args->filter;
                        if (p_Var11 == (RTCFilterFunctionN)0x0) {
                          auVar88 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar185 = ZEXT3264(auVar88);
                        }
                        else {
                          auVar88 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar185 = ZEXT3264(auVar88);
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             ((*(byte *)(local_460._0_8_ + 0x3e) & 0x40) != 0)) {
                            (*p_Var11)(&local_590);
                            auVar173 = ZEXT3264(local_3e0);
                            auVar184 = ZEXT3264(local_500);
                            auVar186 = ZEXT3264(local_4e0);
                            auVar183 = ZEXT3264(local_4c0);
                            auVar178 = ZEXT3264(local_560);
                            auVar177 = ZEXT3264(local_440);
                            auVar181 = ZEXT3264(local_420);
                            auVar180 = ZEXT3264(local_400);
                            auVar179 = ZEXT3264(local_3c0);
                            auVar162 = ZEXT1664(local_5d0);
                            auVar77 = vxorps_avx512vl(auVar77,auVar77);
                            auVar182 = ZEXT1664(auVar77);
                            auVar88 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar185 = ZEXT3264(auVar88);
                            fVar135 = local_480;
                          }
                        }
                        uVar73 = vptestmd_avx512vl(local_5f0,local_5f0);
                        uVar73 = uVar73 & 0xf;
                        auVar77 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar12 = (bool)((byte)uVar73 & 1);
                        bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar73 >> 2) & 1);
                        bVar15 = SUB81(uVar73 >> 3,0);
                        *(uint *)(local_590.ray + 0x80) =
                             (uint)bVar12 * auVar77._0_4_ |
                             (uint)!bVar12 * *(int *)(local_590.ray + 0x80);
                        *(uint *)(local_590.ray + 0x84) =
                             (uint)bVar13 * auVar77._4_4_ |
                             (uint)!bVar13 * *(int *)(local_590.ray + 0x84);
                        *(uint *)(local_590.ray + 0x88) =
                             (uint)bVar14 * auVar77._8_4_ |
                             (uint)!bVar14 * *(int *)(local_590.ray + 0x88);
                        *(uint *)(local_590.ray + 0x8c) =
                             (uint)bVar15 * auVar77._12_4_ |
                             (uint)!bVar15 * *(int *)(local_590.ray + 0x8c);
                        if ((byte)uVar73 != 0) {
                          uVar66 = CONCAT71((int7)(uVar66 >> 8),1);
                          break;
                        }
                      }
                      *(int *)(ray + k * 4 + 0x80) = auVar173._0_4_;
                      uVar66 = 0;
                      uVar73 = 0;
                      local_380 = local_380 ^ 1L << ((ulong)local_2c0 & 0x3f);
                      for (uVar69 = local_380; (uVar69 & 1) == 0;
                          uVar69 = uVar69 >> 1 | 0x8000000000000000) {
                        uVar73 = uVar73 + 1;
                      }
                    } while (local_380 != 0);
                  }
                  goto LAB_01cbb972;
                }
              }
            }
            uVar66 = 0;
          }
        }
      }
LAB_01cbb972:
      if (8 < iVar10) {
        local_460 = vpbroadcastd_avx512vl();
        fStack_378 = 1.0 / (float)local_540._0_4_;
        local_540 = vpbroadcastd_avx512vl();
        local_530 = vpbroadcastd_avx512vl();
        lVar70 = 8;
        local_480 = fVar127;
        fStack_47c = fVar127;
        fStack_478 = fVar127;
        fStack_474 = fVar127;
        fStack_470 = fVar127;
        fStack_46c = fVar127;
        fStack_468 = fVar127;
        fStack_464 = fVar127;
        fStack_374 = fStack_378;
        fStack_370 = fStack_378;
        fStack_36c = fStack_378;
        fStack_368 = fStack_378;
        fStack_364 = fStack_378;
        local_2c0 = (uint)fVar135;
        uStack_2bc = fVar135;
        uStack_2b8 = fVar135;
        uStack_2b4 = fVar135;
        uStack_2b0 = fVar135;
        uStack_2ac = fVar135;
        uStack_2a8 = fVar135;
        uStack_2a4 = fVar135;
        local_380._0_4_ = fStack_378;
        local_380._4_4_ = fStack_378;
        do {
          auVar88 = vpbroadcastd_avx512vl();
          auVar90 = vpor_avx2(auVar88,_DAT_01fe9900);
          uVar18 = vpcmpd_avx512vl(auVar90,local_460,1);
          auVar88 = *(undefined1 (*) [32])(bspline_basis0 + lVar70 * 4 + lVar19);
          auVar85 = *(undefined1 (*) [32])(lVar19 + 0x21aefac + lVar70 * 4);
          auVar86 = *(undefined1 (*) [32])(lVar19 + 0x21af430 + lVar70 * 4);
          auVar87 = *(undefined1 (*) [32])(lVar19 + 0x21af8b4 + lVar70 * 4);
          local_4e0 = auVar186._0_32_;
          auVar89 = vmulps_avx512vl(local_4e0,auVar87);
          local_500 = auVar184._0_32_;
          auVar98 = vmulps_avx512vl(local_500,auVar87);
          auVar44._4_4_ = auVar87._4_4_ * (float)local_100._4_4_;
          auVar44._0_4_ = auVar87._0_4_ * (float)local_100._0_4_;
          auVar44._8_4_ = auVar87._8_4_ * fStack_f8;
          auVar44._12_4_ = auVar87._12_4_ * fStack_f4;
          auVar44._16_4_ = auVar87._16_4_ * fStack_f0;
          auVar44._20_4_ = auVar87._20_4_ * fStack_ec;
          auVar44._24_4_ = auVar87._24_4_ * fStack_e8;
          auVar44._28_4_ = auVar90._28_4_;
          auVar140 = auVar178._0_32_;
          auVar90 = vfmadd231ps_avx512vl(auVar89,auVar86,auVar140);
          local_4c0 = auVar183._0_32_;
          auVar89 = vfmadd231ps_avx512vl(auVar98,auVar86,local_4c0);
          auVar98 = vfmadd231ps_avx512vl(auVar44,auVar86,local_e0);
          auVar160 = auVar181._0_32_;
          auVar90 = vfmadd231ps_avx512vl(auVar90,auVar85,auVar160);
          auVar137 = auVar177._0_32_;
          auVar89 = vfmadd231ps_avx512vl(auVar89,auVar85,auVar137);
          auVar77 = vfmadd231ps_fma(auVar98,auVar85,local_c0);
          local_3c0 = auVar179._0_32_;
          auVar84 = vfmadd231ps_avx512vl(auVar90,auVar88,local_3c0);
          auVar157 = auVar180._0_32_;
          auVar93 = vfmadd231ps_avx512vl(auVar89,auVar88,auVar157);
          auVar90 = *(undefined1 (*) [32])(bspline_basis1 + lVar70 * 4 + lVar19);
          auVar89 = *(undefined1 (*) [32])(lVar19 + 0x21b13cc + lVar70 * 4);
          auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar88,local_a0);
          auVar98 = *(undefined1 (*) [32])(lVar19 + 0x21b1850 + lVar70 * 4);
          auVar97 = *(undefined1 (*) [32])(lVar19 + 0x21b1cd4 + lVar70 * 4);
          auVar91 = vmulps_avx512vl(local_4e0,auVar97);
          auVar92 = vmulps_avx512vl(local_500,auVar97);
          auVar45._4_4_ = auVar97._4_4_ * (float)local_100._4_4_;
          auVar45._0_4_ = auVar97._0_4_ * (float)local_100._0_4_;
          auVar45._8_4_ = auVar97._8_4_ * fStack_f8;
          auVar45._12_4_ = auVar97._12_4_ * fStack_f4;
          auVar45._16_4_ = auVar97._16_4_ * fStack_f0;
          auVar45._20_4_ = auVar97._20_4_ * fStack_ec;
          auVar45._24_4_ = auVar97._24_4_ * fStack_e8;
          auVar45._28_4_ = uStack_e4;
          auVar91 = vfmadd231ps_avx512vl(auVar91,auVar98,auVar140);
          auVar92 = vfmadd231ps_avx512vl(auVar92,auVar98,local_4c0);
          auVar94 = vfmadd231ps_avx512vl(auVar45,auVar98,local_e0);
          auVar91 = vfmadd231ps_avx512vl(auVar91,auVar89,auVar160);
          auVar92 = vfmadd231ps_avx512vl(auVar92,auVar89,auVar137);
          auVar79 = vfmadd231ps_fma(auVar94,auVar89,local_c0);
          auVar94 = vfmadd231ps_avx512vl(auVar91,auVar90,local_3c0);
          auVar82 = vfmadd231ps_avx512vl(auVar92,auVar90,auVar157);
          auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar90,local_a0);
          auVar83 = vmaxps_avx512vl(ZEXT1632(auVar77),ZEXT1632(auVar79));
          auVar91 = vsubps_avx(auVar94,auVar84);
          auVar92 = vsubps_avx(auVar82,auVar93);
          auVar95 = vmulps_avx512vl(auVar93,auVar91);
          auVar96 = vmulps_avx512vl(auVar84,auVar92);
          auVar95 = vsubps_avx512vl(auVar95,auVar96);
          auVar96 = vmulps_avx512vl(auVar92,auVar92);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar91,auVar91);
          auVar83 = vmulps_avx512vl(auVar83,auVar83);
          auVar83 = vmulps_avx512vl(auVar83,auVar96);
          auVar95 = vmulps_avx512vl(auVar95,auVar95);
          uVar136 = vcmpps_avx512vl(auVar95,auVar83,2);
          bVar72 = (byte)uVar18 & (byte)uVar136;
          if (bVar72 == 0) {
            auVar177 = ZEXT3264(auVar137);
            auVar178 = ZEXT3264(auVar140);
          }
          else {
            auVar97 = vmulps_avx512vl(local_4a0,auVar97);
            auVar98 = vfmadd213ps_avx512vl(auVar98,local_160,auVar97);
            auVar89 = vfmadd213ps_avx512vl(auVar89,local_140,auVar98);
            auVar90 = vfmadd213ps_avx512vl(auVar90,local_120,auVar89);
            auVar87 = vmulps_avx512vl(local_4a0,auVar87);
            auVar86 = vfmadd213ps_avx512vl(auVar86,local_160,auVar87);
            auVar85 = vfmadd213ps_avx512vl(auVar85,local_140,auVar86);
            auVar89 = vfmadd213ps_avx512vl(auVar88,local_120,auVar85);
            auVar88 = *(undefined1 (*) [32])(lVar19 + 0x21afd38 + lVar70 * 4);
            auVar85 = *(undefined1 (*) [32])(lVar19 + 0x21b01bc + lVar70 * 4);
            auVar86 = *(undefined1 (*) [32])(lVar19 + 0x21b0640 + lVar70 * 4);
            auVar87 = *(undefined1 (*) [32])(lVar19 + 0x21b0ac4 + lVar70 * 4);
            auVar98 = vmulps_avx512vl(local_4e0,auVar87);
            auVar97 = vmulps_avx512vl(local_500,auVar87);
            auVar87 = vmulps_avx512vl(local_4a0,auVar87);
            auVar98 = vfmadd231ps_avx512vl(auVar98,auVar86,auVar140);
            auVar97 = vfmadd231ps_avx512vl(auVar97,auVar86,local_4c0);
            auVar86 = vfmadd231ps_avx512vl(auVar87,local_160,auVar86);
            auVar87 = vfmadd231ps_avx512vl(auVar98,auVar85,auVar160);
            auVar98 = vfmadd231ps_avx512vl(auVar97,auVar85,auVar137);
            auVar85 = vfmadd231ps_avx512vl(auVar86,local_140,auVar85);
            auVar87 = vfmadd231ps_avx512vl(auVar87,auVar88,local_3c0);
            auVar98 = vfmadd231ps_avx512vl(auVar98,auVar88,auVar157);
            auVar97 = vfmadd231ps_avx512vl(auVar85,local_120,auVar88);
            auVar88 = *(undefined1 (*) [32])(lVar19 + 0x21b2158 + lVar70 * 4);
            auVar85 = *(undefined1 (*) [32])(lVar19 + 0x21b2a60 + lVar70 * 4);
            auVar86 = *(undefined1 (*) [32])(lVar19 + 0x21b2ee4 + lVar70 * 4);
            auVar83 = vmulps_avx512vl(local_4e0,auVar86);
            auVar95 = vmulps_avx512vl(local_500,auVar86);
            auVar86 = vmulps_avx512vl(local_4a0,auVar86);
            auVar83 = vfmadd231ps_avx512vl(auVar83,auVar85,auVar140);
            auVar95 = vfmadd231ps_avx512vl(auVar95,auVar85,local_4c0);
            auVar86 = vfmadd231ps_avx512vl(auVar86,local_160,auVar85);
            auVar85 = *(undefined1 (*) [32])(lVar19 + 0x21b25dc + lVar70 * 4);
            auVar83 = vfmadd231ps_avx512vl(auVar83,auVar85,auVar160);
            auVar95 = vfmadd231ps_avx512vl(auVar95,auVar85,auVar137);
            auVar85 = vfmadd231ps_avx512vl(auVar86,local_140,auVar85);
            auVar86 = vfmadd231ps_avx512vl(auVar83,auVar88,local_3c0);
            auVar83 = vfmadd231ps_avx512vl(auVar95,auVar88,auVar157);
            auVar85 = vfmadd231ps_avx512vl(auVar85,local_120,auVar88);
            auVar95 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar87,auVar95);
            vandps_avx512vl(auVar98,auVar95);
            auVar88 = vmaxps_avx(auVar95,auVar95);
            vandps_avx512vl(auVar97,auVar95);
            auVar88 = vmaxps_avx(auVar88,auVar95);
            auVar63._4_4_ = fStack_47c;
            auVar63._0_4_ = local_480;
            auVar63._8_4_ = fStack_478;
            auVar63._12_4_ = fStack_474;
            auVar63._16_4_ = fStack_470;
            auVar63._20_4_ = fStack_46c;
            auVar63._24_4_ = fStack_468;
            auVar63._28_4_ = fStack_464;
            uVar73 = vcmpps_avx512vl(auVar88,auVar63,1);
            bVar12 = (bool)((byte)uVar73 & 1);
            auVar110._0_4_ = (float)((uint)bVar12 * auVar91._0_4_ | (uint)!bVar12 * auVar87._0_4_);
            bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar110._4_4_ = (float)((uint)bVar12 * auVar91._4_4_ | (uint)!bVar12 * auVar87._4_4_);
            bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar110._8_4_ = (float)((uint)bVar12 * auVar91._8_4_ | (uint)!bVar12 * auVar87._8_4_);
            bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar110._12_4_ =
                 (float)((uint)bVar12 * auVar91._12_4_ | (uint)!bVar12 * auVar87._12_4_);
            bVar12 = (bool)((byte)(uVar73 >> 4) & 1);
            auVar110._16_4_ =
                 (float)((uint)bVar12 * auVar91._16_4_ | (uint)!bVar12 * auVar87._16_4_);
            bVar12 = (bool)((byte)(uVar73 >> 5) & 1);
            auVar110._20_4_ =
                 (float)((uint)bVar12 * auVar91._20_4_ | (uint)!bVar12 * auVar87._20_4_);
            bVar12 = (bool)((byte)(uVar73 >> 6) & 1);
            auVar110._24_4_ =
                 (float)((uint)bVar12 * auVar91._24_4_ | (uint)!bVar12 * auVar87._24_4_);
            bVar12 = SUB81(uVar73 >> 7,0);
            auVar110._28_4_ = (uint)bVar12 * auVar91._28_4_ | (uint)!bVar12 * auVar87._28_4_;
            bVar12 = (bool)((byte)uVar73 & 1);
            auVar111._0_4_ = (float)((uint)bVar12 * auVar92._0_4_ | (uint)!bVar12 * auVar98._0_4_);
            bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar111._4_4_ = (float)((uint)bVar12 * auVar92._4_4_ | (uint)!bVar12 * auVar98._4_4_);
            bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar111._8_4_ = (float)((uint)bVar12 * auVar92._8_4_ | (uint)!bVar12 * auVar98._8_4_);
            bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar111._12_4_ =
                 (float)((uint)bVar12 * auVar92._12_4_ | (uint)!bVar12 * auVar98._12_4_);
            bVar12 = (bool)((byte)(uVar73 >> 4) & 1);
            auVar111._16_4_ =
                 (float)((uint)bVar12 * auVar92._16_4_ | (uint)!bVar12 * auVar98._16_4_);
            bVar12 = (bool)((byte)(uVar73 >> 5) & 1);
            auVar111._20_4_ =
                 (float)((uint)bVar12 * auVar92._20_4_ | (uint)!bVar12 * auVar98._20_4_);
            bVar12 = (bool)((byte)(uVar73 >> 6) & 1);
            auVar111._24_4_ =
                 (float)((uint)bVar12 * auVar92._24_4_ | (uint)!bVar12 * auVar98._24_4_);
            bVar12 = SUB81(uVar73 >> 7,0);
            auVar111._28_4_ = (uint)bVar12 * auVar92._28_4_ | (uint)!bVar12 * auVar98._28_4_;
            vandps_avx512vl(auVar86,auVar95);
            vandps_avx512vl(auVar83,auVar95);
            auVar88 = vmaxps_avx(auVar111,auVar111);
            vandps_avx512vl(auVar85,auVar95);
            auVar88 = vmaxps_avx(auVar88,auVar111);
            uVar73 = vcmpps_avx512vl(auVar88,auVar63,1);
            bVar12 = (bool)((byte)uVar73 & 1);
            auVar112._0_4_ = (uint)bVar12 * auVar91._0_4_ | (uint)!bVar12 * auVar86._0_4_;
            bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar112._4_4_ = (uint)bVar12 * auVar91._4_4_ | (uint)!bVar12 * auVar86._4_4_;
            bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar112._8_4_ = (uint)bVar12 * auVar91._8_4_ | (uint)!bVar12 * auVar86._8_4_;
            bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar112._12_4_ = (uint)bVar12 * auVar91._12_4_ | (uint)!bVar12 * auVar86._12_4_;
            bVar12 = (bool)((byte)(uVar73 >> 4) & 1);
            auVar112._16_4_ = (uint)bVar12 * auVar91._16_4_ | (uint)!bVar12 * auVar86._16_4_;
            bVar12 = (bool)((byte)(uVar73 >> 5) & 1);
            auVar112._20_4_ = (uint)bVar12 * auVar91._20_4_ | (uint)!bVar12 * auVar86._20_4_;
            bVar12 = (bool)((byte)(uVar73 >> 6) & 1);
            auVar112._24_4_ = (uint)bVar12 * auVar91._24_4_ | (uint)!bVar12 * auVar86._24_4_;
            bVar12 = SUB81(uVar73 >> 7,0);
            auVar112._28_4_ = (uint)bVar12 * auVar91._28_4_ | (uint)!bVar12 * auVar86._28_4_;
            bVar12 = (bool)((byte)uVar73 & 1);
            auVar113._0_4_ = (float)((uint)bVar12 * auVar92._0_4_ | (uint)!bVar12 * auVar83._0_4_);
            bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar113._4_4_ = (float)((uint)bVar12 * auVar92._4_4_ | (uint)!bVar12 * auVar83._4_4_);
            bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar113._8_4_ = (float)((uint)bVar12 * auVar92._8_4_ | (uint)!bVar12 * auVar83._8_4_);
            bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar113._12_4_ =
                 (float)((uint)bVar12 * auVar92._12_4_ | (uint)!bVar12 * auVar83._12_4_);
            bVar12 = (bool)((byte)(uVar73 >> 4) & 1);
            auVar113._16_4_ =
                 (float)((uint)bVar12 * auVar92._16_4_ | (uint)!bVar12 * auVar83._16_4_);
            bVar12 = (bool)((byte)(uVar73 >> 5) & 1);
            auVar113._20_4_ =
                 (float)((uint)bVar12 * auVar92._20_4_ | (uint)!bVar12 * auVar83._20_4_);
            bVar12 = (bool)((byte)(uVar73 >> 6) & 1);
            auVar113._24_4_ =
                 (float)((uint)bVar12 * auVar92._24_4_ | (uint)!bVar12 * auVar83._24_4_);
            bVar12 = SUB81(uVar73 >> 7,0);
            auVar113._28_4_ = (uint)bVar12 * auVar92._28_4_ | (uint)!bVar12 * auVar83._28_4_;
            auVar165._8_4_ = 0x80000000;
            auVar165._0_8_ = 0x8000000080000000;
            auVar165._12_4_ = 0x80000000;
            auVar165._16_4_ = 0x80000000;
            auVar165._20_4_ = 0x80000000;
            auVar165._24_4_ = 0x80000000;
            auVar165._28_4_ = 0x80000000;
            auVar88 = vxorps_avx512vl(auVar112,auVar165);
            auVar83 = auVar182._0_32_;
            auVar85 = vfmadd213ps_avx512vl(auVar110,auVar110,auVar83);
            auVar76 = vfmadd231ps_fma(auVar85,auVar111,auVar111);
            auVar85 = vrsqrt14ps_avx512vl(ZEXT1632(auVar76));
            auVar176._8_4_ = 0xbf000000;
            auVar176._0_8_ = 0xbf000000bf000000;
            auVar176._12_4_ = 0xbf000000;
            auVar176._16_4_ = 0xbf000000;
            auVar176._20_4_ = 0xbf000000;
            auVar176._24_4_ = 0xbf000000;
            auVar176._28_4_ = 0xbf000000;
            fVar135 = auVar85._0_4_;
            fVar127 = auVar85._4_4_;
            fVar143 = auVar85._8_4_;
            fVar134 = auVar85._12_4_;
            fVar156 = auVar85._16_4_;
            fVar159 = auVar85._20_4_;
            fVar155 = auVar85._24_4_;
            auVar46._4_4_ = fVar127 * fVar127 * fVar127 * auVar76._4_4_ * -0.5;
            auVar46._0_4_ = fVar135 * fVar135 * fVar135 * auVar76._0_4_ * -0.5;
            auVar46._8_4_ = fVar143 * fVar143 * fVar143 * auVar76._8_4_ * -0.5;
            auVar46._12_4_ = fVar134 * fVar134 * fVar134 * auVar76._12_4_ * -0.5;
            auVar46._16_4_ = fVar156 * fVar156 * fVar156 * -0.0;
            auVar46._20_4_ = fVar159 * fVar159 * fVar159 * -0.0;
            auVar46._24_4_ = fVar155 * fVar155 * fVar155 * -0.0;
            auVar46._28_4_ = auVar111._28_4_;
            auVar86 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar85 = vfmadd231ps_avx512vl(auVar46,auVar86,auVar85);
            auVar47._4_4_ = auVar111._4_4_ * auVar85._4_4_;
            auVar47._0_4_ = auVar111._0_4_ * auVar85._0_4_;
            auVar47._8_4_ = auVar111._8_4_ * auVar85._8_4_;
            auVar47._12_4_ = auVar111._12_4_ * auVar85._12_4_;
            auVar47._16_4_ = auVar111._16_4_ * auVar85._16_4_;
            auVar47._20_4_ = auVar111._20_4_ * auVar85._20_4_;
            auVar47._24_4_ = auVar111._24_4_ * auVar85._24_4_;
            auVar47._28_4_ = 0;
            auVar48._4_4_ = auVar85._4_4_ * -auVar110._4_4_;
            auVar48._0_4_ = auVar85._0_4_ * -auVar110._0_4_;
            auVar48._8_4_ = auVar85._8_4_ * -auVar110._8_4_;
            auVar48._12_4_ = auVar85._12_4_ * -auVar110._12_4_;
            auVar48._16_4_ = auVar85._16_4_ * -auVar110._16_4_;
            auVar48._20_4_ = auVar85._20_4_ * -auVar110._20_4_;
            auVar48._24_4_ = auVar85._24_4_ * -auVar110._24_4_;
            auVar48._28_4_ = auVar111._28_4_;
            auVar87 = vmulps_avx512vl(auVar85,auVar83);
            auVar85 = vfmadd213ps_avx512vl(auVar112,auVar112,auVar83);
            auVar85 = vfmadd231ps_avx512vl(auVar85,auVar113,auVar113);
            auVar98 = vrsqrt14ps_avx512vl(auVar85);
            auVar85 = vmulps_avx512vl(auVar85,auVar176);
            fVar135 = auVar98._0_4_;
            fVar127 = auVar98._4_4_;
            fVar143 = auVar98._8_4_;
            fVar134 = auVar98._12_4_;
            fVar156 = auVar98._16_4_;
            fVar159 = auVar98._20_4_;
            fVar155 = auVar98._24_4_;
            auVar49._4_4_ = fVar127 * fVar127 * fVar127 * auVar85._4_4_;
            auVar49._0_4_ = fVar135 * fVar135 * fVar135 * auVar85._0_4_;
            auVar49._8_4_ = fVar143 * fVar143 * fVar143 * auVar85._8_4_;
            auVar49._12_4_ = fVar134 * fVar134 * fVar134 * auVar85._12_4_;
            auVar49._16_4_ = fVar156 * fVar156 * fVar156 * auVar85._16_4_;
            auVar49._20_4_ = fVar159 * fVar159 * fVar159 * auVar85._20_4_;
            auVar49._24_4_ = fVar155 * fVar155 * fVar155 * auVar85._24_4_;
            auVar49._28_4_ = auVar85._28_4_;
            auVar85 = vfmadd231ps_avx512vl(auVar49,auVar86,auVar98);
            auVar50._4_4_ = auVar113._4_4_ * auVar85._4_4_;
            auVar50._0_4_ = auVar113._0_4_ * auVar85._0_4_;
            auVar50._8_4_ = auVar113._8_4_ * auVar85._8_4_;
            auVar50._12_4_ = auVar113._12_4_ * auVar85._12_4_;
            auVar50._16_4_ = auVar113._16_4_ * auVar85._16_4_;
            auVar50._20_4_ = auVar113._20_4_ * auVar85._20_4_;
            auVar50._24_4_ = auVar113._24_4_ * auVar85._24_4_;
            auVar50._28_4_ = auVar98._28_4_;
            auVar51._4_4_ = auVar85._4_4_ * auVar88._4_4_;
            auVar51._0_4_ = auVar85._0_4_ * auVar88._0_4_;
            auVar51._8_4_ = auVar85._8_4_ * auVar88._8_4_;
            auVar51._12_4_ = auVar85._12_4_ * auVar88._12_4_;
            auVar51._16_4_ = auVar85._16_4_ * auVar88._16_4_;
            auVar51._20_4_ = auVar85._20_4_ * auVar88._20_4_;
            auVar51._24_4_ = auVar85._24_4_ * auVar88._24_4_;
            auVar51._28_4_ = auVar88._28_4_;
            auVar88 = vmulps_avx512vl(auVar85,auVar83);
            auVar76 = vfmadd213ps_fma(auVar47,ZEXT1632(auVar77),auVar84);
            auVar85 = ZEXT1632(auVar77);
            auVar75 = vfmadd213ps_fma(auVar48,auVar85,auVar93);
            auVar86 = vfmadd213ps_avx512vl(auVar87,auVar85,auVar89);
            auVar98 = vfmadd213ps_avx512vl(auVar50,ZEXT1632(auVar79),auVar94);
            auVar78 = vfnmadd213ps_fma(auVar47,auVar85,auVar84);
            auVar97 = ZEXT1632(auVar79);
            auVar5 = vfmadd213ps_fma(auVar51,auVar97,auVar82);
            auVar80 = vfnmadd213ps_fma(auVar48,auVar85,auVar93);
            auVar6 = vfmadd213ps_fma(auVar88,auVar97,auVar90);
            auVar93 = ZEXT1632(auVar77);
            auVar81 = vfnmadd231ps_fma(auVar89,auVar93,auVar87);
            auVar139 = vfnmadd213ps_fma(auVar50,auVar97,auVar94);
            auVar144 = vfnmadd213ps_fma(auVar51,auVar97,auVar82);
            auVar163 = vfnmadd231ps_fma(auVar90,ZEXT1632(auVar79),auVar88);
            auVar90 = vsubps_avx512vl(auVar98,ZEXT1632(auVar78));
            auVar88 = vsubps_avx(ZEXT1632(auVar5),ZEXT1632(auVar80));
            auVar85 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar81));
            auVar52._4_4_ = auVar88._4_4_ * auVar81._4_4_;
            auVar52._0_4_ = auVar88._0_4_ * auVar81._0_4_;
            auVar52._8_4_ = auVar88._8_4_ * auVar81._8_4_;
            auVar52._12_4_ = auVar88._12_4_ * auVar81._12_4_;
            auVar52._16_4_ = auVar88._16_4_ * 0.0;
            auVar52._20_4_ = auVar88._20_4_ * 0.0;
            auVar52._24_4_ = auVar88._24_4_ * 0.0;
            auVar52._28_4_ = auVar87._28_4_;
            auVar77 = vfmsub231ps_fma(auVar52,ZEXT1632(auVar80),auVar85);
            auVar53._4_4_ = auVar85._4_4_ * auVar78._4_4_;
            auVar53._0_4_ = auVar85._0_4_ * auVar78._0_4_;
            auVar53._8_4_ = auVar85._8_4_ * auVar78._8_4_;
            auVar53._12_4_ = auVar85._12_4_ * auVar78._12_4_;
            auVar53._16_4_ = auVar85._16_4_ * 0.0;
            auVar53._20_4_ = auVar85._20_4_ * 0.0;
            auVar53._24_4_ = auVar85._24_4_ * 0.0;
            auVar53._28_4_ = auVar85._28_4_;
            auVar7 = vfmsub231ps_fma(auVar53,ZEXT1632(auVar81),auVar90);
            auVar54._4_4_ = auVar80._4_4_ * auVar90._4_4_;
            auVar54._0_4_ = auVar80._0_4_ * auVar90._0_4_;
            auVar54._8_4_ = auVar80._8_4_ * auVar90._8_4_;
            auVar54._12_4_ = auVar80._12_4_ * auVar90._12_4_;
            auVar54._16_4_ = auVar90._16_4_ * 0.0;
            auVar54._20_4_ = auVar90._20_4_ * 0.0;
            auVar54._24_4_ = auVar90._24_4_ * 0.0;
            auVar54._28_4_ = auVar90._28_4_;
            auVar8 = vfmsub231ps_fma(auVar54,ZEXT1632(auVar78),auVar88);
            auVar88 = vfmadd231ps_avx512vl(ZEXT1632(auVar8),auVar83,ZEXT1632(auVar7));
            auVar88 = vfmadd231ps_avx512vl(auVar88,auVar83,ZEXT1632(auVar77));
            uVar73 = vcmpps_avx512vl(auVar88,auVar83,2);
            bVar65 = (byte)uVar73;
            fVar74 = (float)((uint)(bVar65 & 1) * auVar76._0_4_ |
                            (uint)!(bool)(bVar65 & 1) * auVar139._0_4_);
            bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
            fVar121 = (float)((uint)bVar12 * auVar76._4_4_ | (uint)!bVar12 * auVar139._4_4_);
            bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
            fVar123 = (float)((uint)bVar12 * auVar76._8_4_ | (uint)!bVar12 * auVar139._8_4_);
            bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
            fVar125 = (float)((uint)bVar12 * auVar76._12_4_ | (uint)!bVar12 * auVar139._12_4_);
            auVar97 = ZEXT1632(CONCAT412(fVar125,CONCAT48(fVar123,CONCAT44(fVar121,fVar74))));
            fVar120 = (float)((uint)(bVar65 & 1) * auVar75._0_4_ |
                             (uint)!(bool)(bVar65 & 1) * auVar144._0_4_);
            bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
            fVar122 = (float)((uint)bVar12 * auVar75._4_4_ | (uint)!bVar12 * auVar144._4_4_);
            bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
            fVar124 = (float)((uint)bVar12 * auVar75._8_4_ | (uint)!bVar12 * auVar144._8_4_);
            bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
            fVar126 = (float)((uint)bVar12 * auVar75._12_4_ | (uint)!bVar12 * auVar144._12_4_);
            auVar91 = ZEXT1632(CONCAT412(fVar126,CONCAT48(fVar124,CONCAT44(fVar122,fVar120))));
            auVar114._0_4_ =
                 (float)((uint)(bVar65 & 1) * auVar86._0_4_ |
                        (uint)!(bool)(bVar65 & 1) * auVar163._0_4_);
            bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar114._4_4_ = (float)((uint)bVar12 * auVar86._4_4_ | (uint)!bVar12 * auVar163._4_4_);
            bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar114._8_4_ = (float)((uint)bVar12 * auVar86._8_4_ | (uint)!bVar12 * auVar163._8_4_);
            bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar114._12_4_ =
                 (float)((uint)bVar12 * auVar86._12_4_ | (uint)!bVar12 * auVar163._12_4_);
            fVar143 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar86._16_4_);
            auVar114._16_4_ = fVar143;
            fVar127 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar86._20_4_);
            auVar114._20_4_ = fVar127;
            fVar135 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar86._24_4_);
            auVar114._24_4_ = fVar135;
            iVar1 = (uint)(byte)(uVar73 >> 7) * auVar86._28_4_;
            auVar114._28_4_ = iVar1;
            auVar88 = vblendmps_avx512vl(ZEXT1632(auVar78),auVar98);
            auVar115._0_4_ =
                 (uint)(bVar65 & 1) * auVar88._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar77._0_4_;
            bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar115._4_4_ = (uint)bVar12 * auVar88._4_4_ | (uint)!bVar12 * auVar77._4_4_;
            bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar115._8_4_ = (uint)bVar12 * auVar88._8_4_ | (uint)!bVar12 * auVar77._8_4_;
            bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar115._12_4_ = (uint)bVar12 * auVar88._12_4_ | (uint)!bVar12 * auVar77._12_4_;
            auVar115._16_4_ = (uint)((byte)(uVar73 >> 4) & 1) * auVar88._16_4_;
            auVar115._20_4_ = (uint)((byte)(uVar73 >> 5) & 1) * auVar88._20_4_;
            auVar115._24_4_ = (uint)((byte)(uVar73 >> 6) & 1) * auVar88._24_4_;
            auVar115._28_4_ = (uint)(byte)(uVar73 >> 7) * auVar88._28_4_;
            auVar88 = vblendmps_avx512vl(ZEXT1632(auVar80),ZEXT1632(auVar5));
            auVar116._0_4_ =
                 (float)((uint)(bVar65 & 1) * auVar88._0_4_ |
                        (uint)!(bool)(bVar65 & 1) * auVar76._0_4_);
            bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar116._4_4_ = (float)((uint)bVar12 * auVar88._4_4_ | (uint)!bVar12 * auVar76._4_4_);
            bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar116._8_4_ = (float)((uint)bVar12 * auVar88._8_4_ | (uint)!bVar12 * auVar76._8_4_);
            bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar116._12_4_ =
                 (float)((uint)bVar12 * auVar88._12_4_ | (uint)!bVar12 * auVar76._12_4_);
            fVar134 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar88._16_4_);
            auVar116._16_4_ = fVar134;
            fVar156 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar88._20_4_);
            auVar116._20_4_ = fVar156;
            fVar159 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar88._24_4_);
            auVar116._24_4_ = fVar159;
            auVar116._28_4_ = (uint)(byte)(uVar73 >> 7) * auVar88._28_4_;
            auVar88 = vblendmps_avx512vl(ZEXT1632(auVar81),ZEXT1632(auVar6));
            auVar117._0_4_ =
                 (float)((uint)(bVar65 & 1) * auVar88._0_4_ |
                        (uint)!(bool)(bVar65 & 1) * auVar75._0_4_);
            bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar117._4_4_ = (float)((uint)bVar12 * auVar88._4_4_ | (uint)!bVar12 * auVar75._4_4_);
            bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar117._8_4_ = (float)((uint)bVar12 * auVar88._8_4_ | (uint)!bVar12 * auVar75._8_4_);
            bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar117._12_4_ =
                 (float)((uint)bVar12 * auVar88._12_4_ | (uint)!bVar12 * auVar75._12_4_);
            fVar142 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar88._16_4_);
            auVar117._16_4_ = fVar142;
            fVar158 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar88._20_4_);
            auVar117._20_4_ = fVar158;
            fVar155 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar88._24_4_);
            auVar117._24_4_ = fVar155;
            iVar2 = (uint)(byte)(uVar73 >> 7) * auVar88._28_4_;
            auVar117._28_4_ = iVar2;
            auVar118._0_4_ =
                 (uint)(bVar65 & 1) * (int)auVar78._0_4_ | (uint)!(bool)(bVar65 & 1) * auVar98._0_4_
            ;
            bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar118._4_4_ = (uint)bVar12 * (int)auVar78._4_4_ | (uint)!bVar12 * auVar98._4_4_;
            bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar118._8_4_ = (uint)bVar12 * (int)auVar78._8_4_ | (uint)!bVar12 * auVar98._8_4_;
            bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar118._12_4_ = (uint)bVar12 * (int)auVar78._12_4_ | (uint)!bVar12 * auVar98._12_4_;
            auVar118._16_4_ = (uint)!(bool)((byte)(uVar73 >> 4) & 1) * auVar98._16_4_;
            auVar118._20_4_ = (uint)!(bool)((byte)(uVar73 >> 5) & 1) * auVar98._20_4_;
            auVar118._24_4_ = (uint)!(bool)((byte)(uVar73 >> 6) & 1) * auVar98._24_4_;
            auVar118._28_4_ = (uint)!SUB81(uVar73 >> 7,0) * auVar98._28_4_;
            bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
            bVar14 = (bool)((byte)(uVar73 >> 2) & 1);
            bVar16 = (bool)((byte)(uVar73 >> 3) & 1);
            bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar73 >> 2) & 1);
            bVar17 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar98 = vsubps_avx512vl(auVar118,auVar97);
            auVar85 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar80._12_4_ |
                                                    (uint)!bVar16 * auVar5._12_4_,
                                                    CONCAT48((uint)bVar14 * (int)auVar80._8_4_ |
                                                             (uint)!bVar14 * auVar5._8_4_,
                                                             CONCAT44((uint)bVar12 *
                                                                      (int)auVar80._4_4_ |
                                                                      (uint)!bVar12 * auVar5._4_4_,
                                                                      (uint)(bVar65 & 1) *
                                                                      (int)auVar80._0_4_ |
                                                                      (uint)!(bool)(bVar65 & 1) *
                                                                      auVar5._0_4_)))),auVar91);
            auVar86 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar81._12_4_ |
                                                    (uint)!bVar17 * auVar6._12_4_,
                                                    CONCAT48((uint)bVar15 * (int)auVar81._8_4_ |
                                                             (uint)!bVar15 * auVar6._8_4_,
                                                             CONCAT44((uint)bVar13 *
                                                                      (int)auVar81._4_4_ |
                                                                      (uint)!bVar13 * auVar6._4_4_,
                                                                      (uint)(bVar65 & 1) *
                                                                      (int)auVar81._0_4_ |
                                                                      (uint)!(bool)(bVar65 & 1) *
                                                                      auVar6._0_4_)))),auVar114);
            auVar87 = vsubps_avx(auVar97,auVar115);
            auVar90 = vsubps_avx(auVar91,auVar116);
            auVar89 = vsubps_avx(auVar114,auVar117);
            auVar55._4_4_ = auVar86._4_4_ * fVar121;
            auVar55._0_4_ = auVar86._0_4_ * fVar74;
            auVar55._8_4_ = auVar86._8_4_ * fVar123;
            auVar55._12_4_ = auVar86._12_4_ * fVar125;
            auVar55._16_4_ = auVar86._16_4_ * 0.0;
            auVar55._20_4_ = auVar86._20_4_ * 0.0;
            auVar55._24_4_ = auVar86._24_4_ * 0.0;
            auVar55._28_4_ = 0;
            auVar77 = vfmsub231ps_fma(auVar55,auVar114,auVar98);
            auVar146._0_4_ = fVar120 * auVar98._0_4_;
            auVar146._4_4_ = fVar122 * auVar98._4_4_;
            auVar146._8_4_ = fVar124 * auVar98._8_4_;
            auVar146._12_4_ = fVar126 * auVar98._12_4_;
            auVar146._16_4_ = auVar98._16_4_ * 0.0;
            auVar146._20_4_ = auVar98._20_4_ * 0.0;
            auVar146._24_4_ = auVar98._24_4_ * 0.0;
            auVar146._28_4_ = 0;
            auVar76 = vfmsub231ps_fma(auVar146,auVar97,auVar85);
            auVar88 = vfmadd231ps_avx512vl(ZEXT1632(auVar76),auVar83,ZEXT1632(auVar77));
            auVar153._0_4_ = auVar85._0_4_ * auVar114._0_4_;
            auVar153._4_4_ = auVar85._4_4_ * auVar114._4_4_;
            auVar153._8_4_ = auVar85._8_4_ * auVar114._8_4_;
            auVar153._12_4_ = auVar85._12_4_ * auVar114._12_4_;
            auVar153._16_4_ = auVar85._16_4_ * fVar143;
            auVar153._20_4_ = auVar85._20_4_ * fVar127;
            auVar153._24_4_ = auVar85._24_4_ * fVar135;
            auVar153._28_4_ = 0;
            auVar77 = vfmsub231ps_fma(auVar153,auVar91,auVar86);
            auVar92 = vfmadd231ps_avx512vl(auVar88,auVar83,ZEXT1632(auVar77));
            auVar88 = vmulps_avx512vl(auVar89,auVar115);
            auVar88 = vfmsub231ps_avx512vl(auVar88,auVar87,auVar117);
            auVar56._4_4_ = auVar90._4_4_ * auVar117._4_4_;
            auVar56._0_4_ = auVar90._0_4_ * auVar117._0_4_;
            auVar56._8_4_ = auVar90._8_4_ * auVar117._8_4_;
            auVar56._12_4_ = auVar90._12_4_ * auVar117._12_4_;
            auVar56._16_4_ = auVar90._16_4_ * fVar142;
            auVar56._20_4_ = auVar90._20_4_ * fVar158;
            auVar56._24_4_ = auVar90._24_4_ * fVar155;
            auVar56._28_4_ = iVar2;
            auVar77 = vfmsub231ps_fma(auVar56,auVar116,auVar89);
            auVar154._0_4_ = auVar116._0_4_ * auVar87._0_4_;
            auVar154._4_4_ = auVar116._4_4_ * auVar87._4_4_;
            auVar154._8_4_ = auVar116._8_4_ * auVar87._8_4_;
            auVar154._12_4_ = auVar116._12_4_ * auVar87._12_4_;
            auVar154._16_4_ = fVar134 * auVar87._16_4_;
            auVar154._20_4_ = fVar156 * auVar87._20_4_;
            auVar154._24_4_ = fVar159 * auVar87._24_4_;
            auVar154._28_4_ = 0;
            auVar76 = vfmsub231ps_fma(auVar154,auVar90,auVar115);
            auVar88 = vfmadd231ps_avx512vl(ZEXT1632(auVar76),auVar83,auVar88);
            auVar84 = vfmadd231ps_avx512vl(auVar88,auVar83,ZEXT1632(auVar77));
            auVar88 = vmaxps_avx(auVar92,auVar84);
            uVar136 = vcmpps_avx512vl(auVar88,auVar83,2);
            bVar72 = bVar72 & (byte)uVar136;
            auVar177 = ZEXT3264(auVar137);
            if (bVar72 != 0) {
              uVar128 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar172._4_4_ = uVar128;
              auVar172._0_4_ = uVar128;
              auVar172._8_4_ = uVar128;
              auVar172._12_4_ = uVar128;
              auVar172._16_4_ = uVar128;
              auVar172._20_4_ = uVar128;
              auVar172._24_4_ = uVar128;
              auVar172._28_4_ = uVar128;
              auVar173 = ZEXT3264(auVar172);
              auVar57._4_4_ = auVar89._4_4_ * auVar85._4_4_;
              auVar57._0_4_ = auVar89._0_4_ * auVar85._0_4_;
              auVar57._8_4_ = auVar89._8_4_ * auVar85._8_4_;
              auVar57._12_4_ = auVar89._12_4_ * auVar85._12_4_;
              auVar57._16_4_ = auVar89._16_4_ * auVar85._16_4_;
              auVar57._20_4_ = auVar89._20_4_ * auVar85._20_4_;
              auVar57._24_4_ = auVar89._24_4_ * auVar85._24_4_;
              auVar57._28_4_ = auVar88._28_4_;
              auVar75 = vfmsub231ps_fma(auVar57,auVar90,auVar86);
              auVar58._4_4_ = auVar86._4_4_ * auVar87._4_4_;
              auVar58._0_4_ = auVar86._0_4_ * auVar87._0_4_;
              auVar58._8_4_ = auVar86._8_4_ * auVar87._8_4_;
              auVar58._12_4_ = auVar86._12_4_ * auVar87._12_4_;
              auVar58._16_4_ = auVar86._16_4_ * auVar87._16_4_;
              auVar58._20_4_ = auVar86._20_4_ * auVar87._20_4_;
              auVar58._24_4_ = auVar86._24_4_ * auVar87._24_4_;
              auVar58._28_4_ = auVar86._28_4_;
              auVar76 = vfmsub231ps_fma(auVar58,auVar98,auVar89);
              auVar59._4_4_ = auVar90._4_4_ * auVar98._4_4_;
              auVar59._0_4_ = auVar90._0_4_ * auVar98._0_4_;
              auVar59._8_4_ = auVar90._8_4_ * auVar98._8_4_;
              auVar59._12_4_ = auVar90._12_4_ * auVar98._12_4_;
              auVar59._16_4_ = auVar90._16_4_ * auVar98._16_4_;
              auVar59._20_4_ = auVar90._20_4_ * auVar98._20_4_;
              auVar59._24_4_ = auVar90._24_4_ * auVar98._24_4_;
              auVar59._28_4_ = auVar90._28_4_;
              auVar5 = vfmsub231ps_fma(auVar59,auVar87,auVar85);
              auVar77 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar76),ZEXT1632(auVar5));
              auVar88 = vfmadd231ps_avx512vl(ZEXT1632(auVar77),ZEXT1632(auVar75),auVar83);
              auVar85 = vrcp14ps_avx512vl(auVar88);
              auVar87 = auVar185._0_32_;
              auVar86 = vfnmadd213ps_avx512vl(auVar85,auVar88,auVar87);
              auVar77 = vfmadd132ps_fma(auVar86,auVar85,auVar85);
              auVar60._4_4_ = auVar5._4_4_ * auVar114._4_4_;
              auVar60._0_4_ = auVar5._0_4_ * auVar114._0_4_;
              auVar60._8_4_ = auVar5._8_4_ * auVar114._8_4_;
              auVar60._12_4_ = auVar5._12_4_ * auVar114._12_4_;
              auVar60._16_4_ = fVar143 * 0.0;
              auVar60._20_4_ = fVar127 * 0.0;
              auVar60._24_4_ = fVar135 * 0.0;
              auVar60._28_4_ = iVar1;
              auVar76 = vfmadd231ps_fma(auVar60,auVar91,ZEXT1632(auVar76));
              auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar97,ZEXT1632(auVar75));
              fVar135 = auVar77._0_4_;
              fVar127 = auVar77._4_4_;
              fVar143 = auVar77._8_4_;
              fVar134 = auVar77._12_4_;
              local_260 = ZEXT1632(CONCAT412(auVar76._12_4_ * fVar134,
                                             CONCAT48(auVar76._8_4_ * fVar143,
                                                      CONCAT44(auVar76._4_4_ * fVar127,
                                                               auVar76._0_4_ * fVar135))));
              uVar136 = vcmpps_avx512vl(local_260,auVar172,2);
              auVar64._4_4_ = uStack_2bc;
              auVar64._0_4_ = local_2c0;
              auVar64._8_4_ = uStack_2b8;
              auVar64._12_4_ = uStack_2b4;
              auVar64._16_4_ = uStack_2b0;
              auVar64._20_4_ = uStack_2ac;
              auVar64._24_4_ = uStack_2a8;
              auVar64._28_4_ = uStack_2a4;
              uVar18 = vcmpps_avx512vl(local_260,auVar64,0xd);
              bVar72 = (byte)uVar136 & (byte)uVar18 & bVar72;
              if (bVar72 != 0) {
                uVar136 = vcmpps_avx512vl(auVar88,auVar83,4);
                bVar72 = bVar72 & (byte)uVar136;
                auVar162 = ZEXT1664(local_5d0);
                auVar178 = ZEXT3264(local_560);
                if (bVar72 != 0) {
                  fVar156 = auVar92._0_4_ * fVar135;
                  fVar159 = auVar92._4_4_ * fVar127;
                  auVar61._4_4_ = fVar159;
                  auVar61._0_4_ = fVar156;
                  fVar155 = auVar92._8_4_ * fVar143;
                  auVar61._8_4_ = fVar155;
                  fVar158 = auVar92._12_4_ * fVar134;
                  auVar61._12_4_ = fVar158;
                  fVar142 = auVar92._16_4_ * 0.0;
                  auVar61._16_4_ = fVar142;
                  fVar74 = auVar92._20_4_ * 0.0;
                  auVar61._20_4_ = fVar74;
                  fVar120 = auVar92._24_4_ * 0.0;
                  auVar61._24_4_ = fVar120;
                  auVar61._28_4_ = auVar88._28_4_;
                  auVar85 = vsubps_avx512vl(auVar87,auVar61);
                  local_2a0._0_4_ =
                       (float)((uint)(bVar65 & 1) * (int)fVar156 |
                              (uint)!(bool)(bVar65 & 1) * auVar85._0_4_);
                  bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
                  local_2a0._4_4_ =
                       (float)((uint)bVar12 * (int)fVar159 | (uint)!bVar12 * auVar85._4_4_);
                  bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
                  local_2a0._8_4_ =
                       (float)((uint)bVar12 * (int)fVar155 | (uint)!bVar12 * auVar85._8_4_);
                  bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
                  local_2a0._12_4_ =
                       (float)((uint)bVar12 * (int)fVar158 | (uint)!bVar12 * auVar85._12_4_);
                  bVar12 = (bool)((byte)(uVar73 >> 4) & 1);
                  local_2a0._16_4_ =
                       (float)((uint)bVar12 * (int)fVar142 | (uint)!bVar12 * auVar85._16_4_);
                  bVar12 = (bool)((byte)(uVar73 >> 5) & 1);
                  local_2a0._20_4_ =
                       (float)((uint)bVar12 * (int)fVar74 | (uint)!bVar12 * auVar85._20_4_);
                  bVar12 = (bool)((byte)(uVar73 >> 6) & 1);
                  local_2a0._24_4_ =
                       (float)((uint)bVar12 * (int)fVar120 | (uint)!bVar12 * auVar85._24_4_);
                  bVar12 = SUB81(uVar73 >> 7,0);
                  local_2a0._28_4_ =
                       (float)((uint)bVar12 * auVar88._28_4_ | (uint)!bVar12 * auVar85._28_4_);
                  auVar88 = vsubps_avx(ZEXT1632(auVar79),auVar93);
                  auVar77 = vfmadd213ps_fma(auVar88,local_2a0,auVar93);
                  uVar128 = *(undefined4 *)((long)local_5e0->ray_space + k * 4 + -0x10);
                  auVar26._4_4_ = uVar128;
                  auVar26._0_4_ = uVar128;
                  auVar26._8_4_ = uVar128;
                  auVar26._12_4_ = uVar128;
                  auVar26._16_4_ = uVar128;
                  auVar26._20_4_ = uVar128;
                  auVar26._24_4_ = uVar128;
                  auVar26._28_4_ = uVar128;
                  auVar88 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar77._12_4_ + auVar77._12_4_,
                                                               CONCAT48(auVar77._8_4_ +
                                                                        auVar77._8_4_,
                                                                        CONCAT44(auVar77._4_4_ +
                                                                                 auVar77._4_4_,
                                                                                 auVar77._0_4_ +
                                                                                 auVar77._0_4_)))),
                                            auVar26);
                  uVar136 = vcmpps_avx512vl(local_260,auVar88,6);
                  if (((byte)uVar136 & bVar72) != 0) {
                    auVar138._0_4_ = auVar84._0_4_ * fVar135;
                    auVar138._4_4_ = auVar84._4_4_ * fVar127;
                    auVar138._8_4_ = auVar84._8_4_ * fVar143;
                    auVar138._12_4_ = auVar84._12_4_ * fVar134;
                    auVar138._16_4_ = auVar84._16_4_ * 0.0;
                    auVar138._20_4_ = auVar84._20_4_ * 0.0;
                    auVar138._24_4_ = auVar84._24_4_ * 0.0;
                    auVar138._28_4_ = 0;
                    auVar88 = vsubps_avx512vl(auVar87,auVar138);
                    auVar119._0_4_ =
                         (uint)(bVar65 & 1) * (int)auVar138._0_4_ |
                         (uint)!(bool)(bVar65 & 1) * auVar88._0_4_;
                    bVar12 = (bool)((byte)(uVar73 >> 1) & 1);
                    auVar119._4_4_ =
                         (uint)bVar12 * (int)auVar138._4_4_ | (uint)!bVar12 * auVar88._4_4_;
                    bVar12 = (bool)((byte)(uVar73 >> 2) & 1);
                    auVar119._8_4_ =
                         (uint)bVar12 * (int)auVar138._8_4_ | (uint)!bVar12 * auVar88._8_4_;
                    bVar12 = (bool)((byte)(uVar73 >> 3) & 1);
                    auVar119._12_4_ =
                         (uint)bVar12 * (int)auVar138._12_4_ | (uint)!bVar12 * auVar88._12_4_;
                    bVar12 = (bool)((byte)(uVar73 >> 4) & 1);
                    auVar119._16_4_ =
                         (uint)bVar12 * (int)auVar138._16_4_ | (uint)!bVar12 * auVar88._16_4_;
                    bVar12 = (bool)((byte)(uVar73 >> 5) & 1);
                    auVar119._20_4_ =
                         (uint)bVar12 * (int)auVar138._20_4_ | (uint)!bVar12 * auVar88._20_4_;
                    bVar12 = (bool)((byte)(uVar73 >> 6) & 1);
                    auVar119._24_4_ =
                         (uint)bVar12 * (int)auVar138._24_4_ | (uint)!bVar12 * auVar88._24_4_;
                    auVar119._28_4_ = (uint)!SUB81(uVar73 >> 7,0) * auVar88._28_4_;
                    auVar27._8_4_ = 0x40000000;
                    auVar27._0_8_ = 0x4000000040000000;
                    auVar27._12_4_ = 0x40000000;
                    auVar27._16_4_ = 0x40000000;
                    auVar27._20_4_ = 0x40000000;
                    auVar27._24_4_ = 0x40000000;
                    auVar27._28_4_ = 0x40000000;
                    local_280 = vfmsub132ps_avx512vl(auVar119,auVar87,auVar27);
                    local_240 = (undefined4)lVar70;
                    local_230 = local_5d0;
                    local_220 = local_510._0_8_;
                    uStack_218 = local_510._8_8_;
                    local_210 = local_520._0_8_;
                    uStack_208 = local_520._8_8_;
                    pGVar71 = (context->scene->geometries).items[local_5d8].ptr;
                    if ((pGVar71->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                      bVar65 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar65 = 1, pGVar71->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar77 = vcvtsi2ss_avx512f(auVar179._0_16_,local_240);
                      fVar135 = auVar77._0_4_;
                      local_1e0[0] = (fVar135 + local_2a0._0_4_ + 0.0) * (float)local_380;
                      local_1e0[1] = (fVar135 + local_2a0._4_4_ + 1.0) * local_380._4_4_;
                      local_1e0[2] = (fVar135 + local_2a0._8_4_ + 2.0) * fStack_378;
                      local_1e0[3] = (fVar135 + local_2a0._12_4_ + 3.0) * fStack_374;
                      fStack_1d0 = (fVar135 + local_2a0._16_4_ + 4.0) * fStack_370;
                      fStack_1cc = (fVar135 + local_2a0._20_4_ + 5.0) * fStack_36c;
                      fStack_1c8 = (fVar135 + local_2a0._24_4_ + 6.0) * fStack_368;
                      fStack_1c4 = fVar135 + local_2a0._28_4_ + 7.0;
                      local_1c0 = local_280;
                      local_1a0 = local_260;
                      uVar73 = CONCAT71(0,(byte)uVar136 & bVar72);
                      local_5c0._0_8_ = uVar73;
                      lVar20 = 0;
                      for (; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x8000000000000000) {
                        lVar20 = lVar20 + 1;
                      }
                      local_5b0._0_8_ = lVar20;
                      local_3e0._0_4_ = (int)uVar66;
                      local_180 = auVar172;
                      local_598 = pGVar71;
                      local_23c = iVar10;
                      do {
                        auVar75 = auVar182._0_16_;
                        fVar135 = local_1e0[local_5b0._0_8_];
                        local_320._4_4_ = fVar135;
                        local_320._0_4_ = fVar135;
                        local_320._8_4_ = fVar135;
                        local_320._12_4_ = fVar135;
                        local_310 = *(undefined4 *)(local_1c0 + local_5b0._0_8_ * 4);
                        *(undefined4 *)(ray + k * 4 + 0x80) =
                             *(undefined4 *)(local_1a0 + local_5b0._0_8_ * 4);
                        local_590.context = context->user;
                        fVar127 = 1.0 - fVar135;
                        auVar22._8_4_ = 0x80000000;
                        auVar22._0_8_ = 0x8000000080000000;
                        auVar22._12_4_ = 0x80000000;
                        auVar76 = vxorps_avx512vl(ZEXT416((uint)fVar127),auVar22);
                        auVar77 = ZEXT416((uint)(fVar135 * fVar127 * 4.0));
                        auVar79 = vfnmsub213ss_fma(local_320,local_320,auVar77);
                        auVar77 = vfmadd213ss_fma(ZEXT416((uint)fVar127),ZEXT416((uint)fVar127),
                                                  auVar77);
                        fVar127 = fVar127 * auVar76._0_4_ * 0.5;
                        fVar143 = auVar79._0_4_ * 0.5;
                        fVar134 = auVar77._0_4_ * 0.5;
                        fVar135 = fVar135 * fVar135 * 0.5;
                        auVar149._0_4_ = fVar135 * (float)local_390._0_4_;
                        auVar149._4_4_ = fVar135 * (float)local_390._4_4_;
                        auVar149._8_4_ = fVar135 * fStack_388;
                        auVar149._12_4_ = fVar135 * fStack_384;
                        auVar131._4_4_ = fVar134;
                        auVar131._0_4_ = fVar134;
                        auVar131._8_4_ = fVar134;
                        auVar131._12_4_ = fVar134;
                        auVar77 = vfmadd132ps_fma(auVar131,auVar149,local_520);
                        auVar150._4_4_ = fVar143;
                        auVar150._0_4_ = fVar143;
                        auVar150._8_4_ = fVar143;
                        auVar150._12_4_ = fVar143;
                        auVar77 = vfmadd132ps_fma(auVar150,auVar77,local_510);
                        auVar132._4_4_ = fVar127;
                        auVar132._0_4_ = fVar127;
                        auVar132._8_4_ = fVar127;
                        auVar132._12_4_ = fVar127;
                        auVar77 = vfmadd213ps_fma(auVar132,auVar162._0_16_,auVar77);
                        local_350 = auVar77._0_4_;
                        local_340 = vshufps_avx(auVar77,auVar77,0x55);
                        local_330 = vshufps_avx(auVar77,auVar77,0xaa);
                        local_300 = local_530._0_8_;
                        uStack_2f8 = local_530._8_8_;
                        local_2f0 = local_540;
                        vpcmpeqd_avx2(ZEXT1632(local_540),ZEXT1632(local_540));
                        uStack_2dc = (local_590.context)->instID[0];
                        local_2e0 = uStack_2dc;
                        uStack_2d8 = uStack_2dc;
                        uStack_2d4 = uStack_2dc;
                        uStack_2d0 = (local_590.context)->instPrimID[0];
                        uStack_2cc = uStack_2d0;
                        uStack_2c8 = uStack_2d0;
                        uStack_2c4 = uStack_2d0;
                        local_5f0 = local_3a0;
                        local_590.valid = (int *)local_5f0;
                        local_590.geometryUserPtr = pGVar71->userPtr;
                        local_590.hit = (RTCHitN *)&local_350;
                        local_590.N = 4;
                        local_590.ray = (RTCRayN *)ray;
                        uStack_34c = local_350;
                        uStack_348 = local_350;
                        uStack_344 = local_350;
                        uStack_30c = local_310;
                        uStack_308 = local_310;
                        uStack_304 = local_310;
                        if (pGVar71->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar71->occlusionFilterN)(&local_590);
                          auVar173 = ZEXT3264(local_180);
                          uVar66 = (ulong)(uint)local_3e0._0_4_;
                          auVar178 = ZEXT3264(local_560);
                          auVar177 = ZEXT3264(local_440);
                          auVar181 = ZEXT3264(local_420);
                          auVar180 = ZEXT3264(local_400);
                          auVar179 = ZEXT3264(local_3c0);
                          auVar162 = ZEXT1664(local_5d0);
                          auVar77 = vxorps_avx512vl(auVar75,auVar75);
                          auVar182 = ZEXT1664(auVar77);
                          auVar88 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar185 = ZEXT3264(auVar88);
                          pGVar71 = local_598;
                        }
                        auVar77 = auVar182._0_16_;
                        uVar73 = vptestmd_avx512vl(local_5f0,local_5f0);
                        if ((uVar73 & 0xf) == 0) {
                          auVar183 = ZEXT3264(local_4c0);
                          auVar186 = ZEXT3264(local_4e0);
                          auVar184 = ZEXT3264(local_500);
                        }
                        else {
                          p_Var11 = context->args->filter;
                          if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar71->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var11)(&local_590);
                            auVar173 = ZEXT3264(local_180);
                            uVar66 = (ulong)(uint)local_3e0._0_4_;
                            auVar178 = ZEXT3264(local_560);
                            auVar177 = ZEXT3264(local_440);
                            auVar181 = ZEXT3264(local_420);
                            auVar180 = ZEXT3264(local_400);
                            auVar179 = ZEXT3264(local_3c0);
                            auVar162 = ZEXT1664(local_5d0);
                            auVar77 = vxorps_avx512vl(auVar77,auVar77);
                            auVar182 = ZEXT1664(auVar77);
                            auVar88 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar185 = ZEXT3264(auVar88);
                            pGVar71 = local_598;
                          }
                          uVar73 = vptestmd_avx512vl(local_5f0,local_5f0);
                          uVar73 = uVar73 & 0xf;
                          auVar77 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar12 = (bool)((byte)uVar73 & 1);
                          bVar13 = (bool)((byte)(uVar73 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar73 >> 2) & 1);
                          bVar15 = SUB81(uVar73 >> 3,0);
                          *(uint *)(local_590.ray + 0x80) =
                               (uint)bVar12 * auVar77._0_4_ |
                               (uint)!bVar12 * *(int *)(local_590.ray + 0x80);
                          *(uint *)(local_590.ray + 0x84) =
                               (uint)bVar13 * auVar77._4_4_ |
                               (uint)!bVar13 * *(int *)(local_590.ray + 0x84);
                          *(uint *)(local_590.ray + 0x88) =
                               (uint)bVar14 * auVar77._8_4_ |
                               (uint)!bVar14 * *(int *)(local_590.ray + 0x88);
                          *(uint *)(local_590.ray + 0x8c) =
                               (uint)bVar15 * auVar77._12_4_ |
                               (uint)!bVar15 * *(int *)(local_590.ray + 0x8c);
                          auVar183 = ZEXT3264(local_4c0);
                          auVar186 = ZEXT3264(local_4e0);
                          auVar184 = ZEXT3264(local_500);
                          if ((byte)uVar73 != 0) {
                            bVar65 = 1;
                            break;
                          }
                        }
                        *(int *)(ray + k * 4 + 0x80) = auVar173._0_4_;
                        local_5c0._0_8_ = local_5c0._0_8_ ^ 1L << (local_5b0._0_8_ & 0x3f);
                        bVar65 = 0;
                        lVar20 = 0;
                        for (uVar73 = local_5c0._0_8_; (uVar73 & 1) == 0;
                            uVar73 = uVar73 >> 1 | 0x8000000000000000) {
                          lVar20 = lVar20 + 1;
                        }
                        local_5b0._0_8_ = lVar20;
                      } while (local_5c0._0_8_ != 0);
                    }
                    uVar66 = CONCAT71((int7)(uVar66 >> 8),(byte)uVar66 | bVar65);
                  }
                }
                goto LAB_01cbc4f9;
              }
            }
            auVar178 = ZEXT3264(local_560);
          }
LAB_01cbc4f9:
          lVar70 = lVar70 + 8;
        } while ((int)lVar70 < iVar10);
      }
      bVar72 = (byte)uVar66;
      if ((uVar66 & 1) != 0) break;
      uVar128 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar25._4_4_ = uVar128;
      auVar25._0_4_ = uVar128;
      auVar25._8_4_ = uVar128;
      auVar25._12_4_ = uVar128;
      auVar25._16_4_ = uVar128;
      auVar25._20_4_ = uVar128;
      auVar25._24_4_ = uVar128;
      auVar25._28_4_ = uVar128;
      uVar136 = vcmpps_avx512vl(local_80,auVar25,2);
      uVar67 = (uint)uVar68 & (uint)uVar136;
      uVar68 = (ulong)uVar67;
    } while (uVar67 != 0);
  }
  return (bool)(bVar72 & 1);
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }